

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_fEf.cpp
# Opt level: O1

Matrix<double,_5,_1,_0,_5,_1> *
DronePoseLib::ValtonenOrnhagArxiv2021::calculate_coefficients
          (Matrix<double,_5,_1,_0,_5,_1> *__return_storage_ptr__,Matrix<double,_27,_1,_0,_27,_1> *x)

{
  double dVar1;
  double dVar2;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *pCVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_f8;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[5];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[8];
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xb];
  dVar92 = dVar88 * dVar138 * dVar135 * dVar28;
  dVar13 = -dVar88 * dVar138 * dVar135 * dVar28;
  dVar128 = dVar143 * dVar138 * dVar135 * dVar28;
  dVar78 = -dVar143 * dVar138 * dVar135 * dVar28;
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[9];
  dVar47 = -dVar88;
  dVar134 = dVar143 * dVar47 * dVar135;
  dVar117 = dVar88 * dVar143 * dVar135;
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[4];
  dVar4 = dVar143 * dVar47 * dVar135;
  dVar135 = dVar143 * dVar88 * dVar135;
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[6];
  dVar152 = dVar88 * dVar138 * dVar143;
  dVar143 = dVar143 * dVar47 * dVar138;
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar31 = dVar88 * dVar138 * dVar48;
  dVar48 = dVar47 * dVar138 * dVar48;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[10];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xc];
  dVar47 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x11];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x12];
  dVar87 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x18];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar30 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xe];
  dVar132 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xf];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x10];
  dVar79 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x16];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x15];
  dVar5 = dVar117 * dVar28 * dVar30;
  dVar6 = dVar134 * dVar28 * dVar30;
  dVar7 = dVar135 * dVar28 * dVar30;
  dVar8 = dVar4 * dVar28 * dVar30;
  dVar49 = dVar12 * dVar12;
  dVar14 = dVar2 * dVar2;
  local_f8.m_row = 0;
  local_f8.m_col = 1;
  local_f8.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
  m_data.array[0] =
       dVar48 * dVar28 * dVar10 * dVar47 * dVar79 * dVar14 +
       dVar31 * dVar28 * dVar10 * dVar47 * dVar9 * dVar2 * dVar12 +
       dVar88 * dVar31 * dVar28 * dVar47 * dVar79 * dVar2 * dVar12 +
       dVar48 * dVar28 * dVar88 * dVar47 * dVar9 * dVar49 +
       dVar138 * dVar31 * dVar30 * dVar47 * dVar79 * dVar14 +
       dVar48 * dVar138 * dVar30 * dVar47 * dVar9 * dVar2 * dVar12 +
       dVar29 * dVar48 * dVar30 * dVar47 * dVar79 * dVar2 * dVar12 +
       dVar31 * dVar29 * dVar30 * dVar47 * dVar9 * dVar49 +
       dVar143 * dVar28 * dVar10 * dVar47 * dVar87 * dVar14 +
       dVar152 * dVar28 * dVar10 * dVar47 * dVar1 * dVar2 * dVar12 +
       dVar152 * dVar28 * dVar88 * dVar47 * dVar87 * dVar2 * dVar12 +
       dVar143 * dVar28 * dVar88 * dVar47 * dVar1 * dVar49 +
       dVar152 * dVar138 * dVar30 * dVar47 * dVar87 * dVar14 +
       dVar143 * dVar138 * dVar30 * dVar47 * dVar1 * dVar2 * dVar12 +
       dVar143 * dVar29 * dVar30 * dVar47 * dVar87 * dVar2 * dVar12 +
       dVar152 * dVar29 * dVar30 * dVar47 * dVar1 * dVar49 +
       dVar7 * dVar11 * dVar79 * dVar14 +
       dVar8 * dVar11 * dVar9 * dVar2 * dVar12 +
       dVar132 * dVar8 * dVar79 * dVar2 * dVar12 +
       dVar7 * dVar132 * dVar9 * dVar49 +
       dVar4 * dVar138 * dVar30 * dVar47 * dVar79 * dVar14 +
       dVar135 * dVar138 * dVar30 * dVar47 * dVar9 * dVar2 * dVar12 +
       dVar135 * dVar29 * dVar30 * dVar47 * dVar79 * dVar2 * dVar12 +
       dVar4 * dVar29 * dVar30 * dVar47 * dVar9 * dVar49 +
       dVar5 * dVar11 * dVar87 * dVar14 +
       dVar6 * dVar11 * dVar1 * dVar2 * dVar12 +
       dVar6 * dVar132 * dVar87 * dVar2 * dVar12 +
       dVar5 * dVar132 * dVar1 * dVar49 +
       dVar134 * dVar138 * dVar30 * dVar47 * dVar87 * dVar14 +
       dVar117 * dVar138 * dVar30 * dVar47 * dVar1 * dVar2 * dVar12 +
       dVar117 * dVar29 * dVar30 * dVar47 * dVar87 * dVar2 * dVar12 +
       dVar134 * dVar29 * dVar30 * dVar47 * dVar1 * dVar49 +
       dVar78 * dVar30 * dVar11 * dVar79 * dVar14 +
       dVar128 * dVar30 * dVar11 * dVar9 * dVar2 * dVar12 +
       dVar128 * dVar30 * dVar132 * dVar79 * dVar2 * dVar12 +
       dVar78 * dVar30 * dVar132 * dVar9 * dVar49 +
       dVar128 * dVar10 * dVar47 * dVar79 * dVar14 +
       dVar78 * dVar10 * dVar47 * dVar9 * dVar2 * dVar12 +
       dVar78 * dVar88 * dVar47 * dVar79 * dVar2 * dVar12 +
       dVar128 * dVar88 * dVar47 * dVar9 * dVar49 +
       dVar13 * dVar30 * dVar11 * dVar87 * dVar14 +
       dVar92 * dVar30 * dVar11 * dVar1 * dVar2 * dVar12 +
       dVar92 * dVar30 * dVar132 * dVar87 * dVar2 * dVar12 +
       dVar13 * dVar30 * dVar132 * dVar1 * dVar49 +
       dVar92 * dVar10 * dVar47 * dVar87 * dVar14 +
       dVar13 * dVar10 * dVar47 * dVar1 * dVar2 * dVar12 +
       dVar92 * dVar88 * dVar47 * dVar1 * dVar49 +
       dVar13 * dVar88 * dVar47 * dVar87 * dVar2 * dVar12;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar79 = -dVar88;
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[4];
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[5];
  dVar32 = dVar88 * dVar28;
  dVar80 = dVar79 * dVar28;
  dVar93 = -dVar143;
  dVar15 = dVar143 * dVar28;
  dVar94 = dVar93 * dVar28;
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar153 = -dVar29;
  dVar5 = dVar29 * dVar138;
  dVar144 = dVar138 * dVar153;
  dVar33 = dVar29 * dVar135;
  dVar129 = dVar135 * dVar153;
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[8];
  dVar50 = dVar138 * dVar79 * dVar48;
  dVar47 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[9];
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xe];
  dVar87 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x11];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x12];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar8 = dVar88 * dVar138 * dVar48;
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar30 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xb];
  dVar132 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xc];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar99 = dVar135 * dVar79 * dVar48;
  dVar140 = dVar88 * dVar135 * dVar48;
  dVar141 = dVar140 * dVar30;
  dVar100 = dVar99 * dVar30;
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar51 = dVar32 * dVar88;
  dVar34 = dVar80 * dVar88;
  dVar79 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar101 = dVar32 * dVar79;
  dVar35 = dVar30 * dVar101;
  dVar81 = dVar80 * dVar48;
  dVar118 = dVar47 * dVar81;
  dVar82 = dVar15 * dVar88;
  dVar16 = dVar94 * dVar88;
  dVar83 = dVar144 * dVar88 * dVar30;
  dVar84 = dVar33 * dVar88;
  dVar85 = dVar129 * dVar88;
  dVar86 = dVar85 * dVar30;
  dVar154 = dVar153 * dVar28 * dVar88;
  dVar13 = dVar88 * dVar29 * dVar28;
  dVar14 = dVar13 * dVar30 * dVar11;
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xf];
  dVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x10];
  dVar52 = dVar34 * dVar30 * dVar1;
  dVar80 = dVar80 * dVar79;
  dVar17 = dVar80 * dVar30;
  dVar32 = dVar32 * dVar48;
  dVar53 = dVar47 * dVar32;
  dVar102 = dVar138 * dVar93 * dVar48;
  dVar31 = dVar143 * dVar138 * dVar48;
  dVar49 = dVar31 * dVar30;
  dVar103 = dVar102 * dVar30;
  dVar18 = dVar16 * dVar30;
  dVar36 = dVar82 * dVar30;
  dVar104 = dVar5 * dVar88 * dVar30;
  dVar105 = dVar144 * dVar79;
  dVar78 = dVar5 * dVar79;
  dVar54 = dVar30 * dVar105;
  dVar92 = dVar78 * dVar30;
  dVar144 = dVar144 * dVar48;
  dVar117 = dVar47 * dVar144;
  dVar5 = dVar5 * dVar48;
  dVar19 = dVar47 * dVar5;
  dVar128 = dVar5 * dVar10;
  dVar20 = dVar5 * dVar30 * dVar132;
  dVar134 = dVar144 * dVar30 * dVar132;
  dVar21 = dVar84 * dVar30;
  dVar152 = dVar13 * dVar47 * dVar1;
  dVar37 = dVar1 * dVar154 * dVar10;
  dVar22 = dVar154 * dVar30 * dVar132;
  dVar95 = dVar12 * dVar12;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x18];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar96 = dVar32 * dVar10;
  dVar155 = dVar144 * dVar30 * dVar11;
  dVar23 = dVar5 * dVar30 * dVar11;
  dVar55 = dVar154 * dVar30 * dVar11;
  dVar24 = dVar81 * dVar10;
  dVar144 = dVar144 * dVar10;
  dVar25 = dVar154 * dVar47 * dVar1;
  dVar26 = dVar13 * dVar10 * dVar1;
  dVar27 = dVar13 * dVar30 * dVar132;
  dVar106 = dVar2 * dVar2;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x15];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x16];
  dVar125 = dVar51 * dVar30 * dVar1;
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x1a];
  dVar156 = dVar135 * dVar93 * dVar48;
  dVar119 = dVar143 * dVar135 * dVar48;
  dVar150 = dVar15 * dVar48;
  dVar107 = dVar94 * dVar48;
  dVar143 = dVar129 * dVar48;
  dVar48 = dVar33 * dVar48;
  dVar15 = dVar15 * dVar79;
  dVar94 = dVar94 * dVar79;
  dVar126 = dVar153 * dVar28 * dVar79;
  dVar142 = dVar29 * dVar28 * dVar79;
  dVar93 = dVar150 * dVar47;
  dVar153 = dVar107 * dVar47;
  dVar56 = dVar107 * dVar10;
  dVar57 = dVar150 * dVar10;
  dVar136 = dVar129 * dVar79 * dVar30;
  dVar130 = dVar33 * dVar79 * dVar30;
  dVar79 = dVar143 * dVar47;
  dVar33 = dVar48 * dVar47;
  dVar129 = dVar48 * dVar10;
  dVar58 = dVar143 * dVar10;
  dVar131 = dVar143 * dVar30 * dVar11;
  dVar108 = dVar48 * dVar30 * dVar11;
  dVar59 = dVar48 * dVar30 * dVar132;
  dVar137 = dVar143 * dVar30 * dVar132;
  dVar109 = dVar1 * dVar10 * dVar126;
  dVar97 = dVar126 * dVar30 * dVar132;
  dVar145 = dVar132 * dVar142 * dVar30;
  dVar110 = dVar142 * dVar30 * dVar11;
  dVar60 = dVar126 * dVar30 * dVar11;
  dVar111 = dVar94 * dVar30 * dVar1;
  dVar61 = dVar47 * dVar142 * dVar1;
  dVar112 = dVar126 * dVar47 * dVar1;
  dVar62 = dVar142 * dVar10 * dVar1;
  dVar28 = dVar5 * dVar5;
  dVar113 = dVar15 * dVar30 * dVar1;
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x14];
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar29 = dVar88 * dVar88;
  dVar63 = dVar6 * dVar6;
  dVar48 = dVar138 * dVar138;
  local_18 = dVar110 * dVar4 * dVar135 * dVar48 +
             dVar60 * dVar4 * dVar5 * dVar138 * dVar7 +
             dVar9 * dVar60 * dVar135 * dVar138 * dVar88 +
             dVar110 * dVar9 * dVar6 * dVar138 * dVar7 +
             dVar97 * dVar4 * dVar135 * dVar138 * dVar88 +
             dVar145 * dVar4 * dVar5 * dVar88 * dVar7 +
             dVar145 * dVar9 * dVar135 * dVar29 +
             dVar97 * dVar9 * dVar6 * dVar88 * dVar7 +
             dVar109 * dVar4 * dVar135 * dVar48 +
             dVar4 * dVar62 * dVar5 * dVar138 * dVar7 +
             dVar62 * dVar9 * dVar135 * dVar138 * dVar88 +
             dVar109 * dVar9 * dVar6 * dVar138 * dVar7 +
             dVar10 * dVar126 * dVar132 * dVar87 * dVar6 * dVar138 * dVar7 +
             dVar142 * dVar10 * dVar132 * dVar87 * dVar5 * dVar88 * dVar7 +
             dVar61 * dVar4 * dVar135 * dVar138 * dVar88 +
             dVar112 * dVar4 * dVar5 * dVar88 * dVar7 +
             dVar112 * dVar9 * dVar135 * dVar29 +
             dVar61 * dVar9 * dVar6 * dVar88 * dVar7 +
             dVar47 * dVar142 * dVar11 * dVar87 * dVar6 * dVar138 * dVar7 +
             dVar126 * dVar47 * dVar11 * dVar87 * dVar5 * dVar88 * dVar7 +
             dVar14 * dVar4 * dVar143 * dVar48 +
             dVar4 * dVar55 * dVar2 * dVar138 * dVar7 +
             dVar55 * dVar9 * dVar143 * dVar138 * dVar88 +
             dVar14 * dVar9 * dVar12 * dVar138 * dVar7 +
             dVar22 * dVar4 * dVar143 * dVar138 * dVar88 +
             dVar27 * dVar4 * dVar2 * dVar88 * dVar7 +
             dVar27 * dVar9 * dVar143 * dVar29 +
             dVar22 * dVar9 * dVar12 * dVar88 * dVar7 +
             dVar37 * dVar4 * dVar143 * dVar48 +
             dVar4 * dVar26 * dVar2 * dVar138 * dVar7 +
             dVar26 * dVar9 * dVar143 * dVar138 * dVar88 +
             dVar37 * dVar9 * dVar12 * dVar138 * dVar7 +
             dVar154 * dVar10 * dVar132 * dVar87 * dVar12 * dVar138 * dVar7 +
             dVar13 * dVar10 * dVar132 * dVar87 * dVar2 * dVar88 * dVar7 +
             dVar152 * dVar4 * dVar143 * dVar138 * dVar88 +
             dVar25 * dVar4 * dVar2 * dVar88 * dVar7 +
             dVar25 * dVar9 * dVar143 * dVar29 +
             dVar152 * dVar9 * dVar12 * dVar88 * dVar7 +
             dVar13 * dVar47 * dVar11 * dVar87 * dVar12 * dVar138 * dVar7 +
             dVar154 * dVar47 * dVar11 * dVar87 * dVar2 * dVar88 * dVar7 +
             dVar131 * dVar4 * dVar135 * dVar48 +
             dVar4 * dVar108 * dVar5 * dVar138 * dVar7 +
             dVar108 * dVar9 * dVar135 * dVar138 * dVar88 +
             dVar131 * dVar9 * dVar5 * dVar88 * dVar7 +
             dVar59 * dVar4 * dVar135 * dVar138 * dVar88 +
             dVar137 * dVar4 * dVar6 * dVar138 * dVar7 +
             dVar9 * dVar137 * dVar135 * dVar29 +
             dVar9 * dVar59 * dVar6 * dVar88 * dVar7 +
             dVar129 * dVar1 * dVar9 * dVar6 * dVar138 * dVar7 +
             dVar58 * dVar1 * dVar9 * dVar5 * dVar88 * dVar7 +
             dVar11 * dVar129 * dVar87 * dVar135 * dVar48 +
             dVar11 * dVar58 * dVar87 * dVar5 * dVar138 * dVar7 +
             dVar58 * dVar132 * dVar87 * dVar135 * dVar138 * dVar88 +
             dVar129 * dVar132 * dVar87 * dVar6 * dVar138 * dVar7 +
             dVar79 * dVar1 * dVar4 * dVar6 * dVar138 * dVar7 +
             dVar33 * dVar1 * dVar4 * dVar5 * dVar88 * dVar7 +
             dVar79 * dVar11 * dVar87 * dVar135 * dVar138 * dVar88 +
             dVar33 * dVar11 * dVar87 * dVar5 * dVar88 * dVar7 +
             dVar33 * dVar132 * dVar87 * dVar135 * dVar29 +
             dVar79 * dVar132 * dVar87 * dVar6 * dVar88 * dVar7 +
             dVar130 * dVar1 * dVar4 * dVar5 * dVar6 * dVar138 +
             dVar136 * dVar1 * dVar4 * dVar28 * dVar88 +
             dVar136 * dVar1 * dVar9 * dVar63 * dVar138 +
             dVar130 * dVar1 * dVar9 * dVar5 * dVar6 * dVar88 +
             dVar136 * dVar11 * dVar87 * dVar5 * dVar6 * dVar138 +
             dVar130 * dVar11 * dVar87 * dVar28 * dVar88 +
             dVar132 * dVar130 * dVar87 * dVar63 * dVar138 +
             dVar132 * dVar136 * dVar87 * dVar5 * dVar6 * dVar88 +
             dVar21 * dVar1 * dVar4 * dVar2 * dVar6 * dVar138 +
             dVar86 * dVar1 * dVar4 * dVar2 * dVar5 * dVar88 +
             dVar86 * dVar1 * dVar9 * dVar12 * dVar6 * dVar138 +
             dVar21 * dVar1 * dVar9 * dVar12 * dVar5 * dVar88 +
             dVar86 * dVar11 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar21 * dVar11 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar21 * dVar132 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar86 * dVar132 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar84 * dVar10 * dVar1 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar85 * dVar10 * dVar1 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar85 * dVar47 * dVar1 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar84 * dVar47 * dVar1 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar155 * dVar4 * dVar143 * dVar48 +
             dVar4 * dVar23 * dVar2 * dVar138 * dVar7 +
             dVar23 * dVar9 * dVar143 * dVar138 * dVar88 +
             dVar155 * dVar9 * dVar2 * dVar88 * dVar7 +
             dVar20 * dVar4 * dVar143 * dVar138 * dVar88 +
             dVar134 * dVar4 * dVar12 * dVar138 * dVar7 +
             dVar9 * dVar134 * dVar143 * dVar29 +
             dVar9 * dVar20 * dVar12 * dVar88 * dVar7 +
             dVar128 * dVar1 * dVar9 * dVar12 * dVar138 * dVar7 +
             dVar144 * dVar1 * dVar9 * dVar2 * dVar88 * dVar7 +
             dVar11 * dVar128 * dVar87 * dVar143 * dVar48 +
             dVar11 * dVar144 * dVar87 * dVar2 * dVar138 * dVar7 +
             dVar144 * dVar132 * dVar87 * dVar143 * dVar138 * dVar88 +
             dVar128 * dVar132 * dVar87 * dVar12 * dVar138 * dVar7 +
             dVar117 * dVar1 * dVar4 * dVar12 * dVar138 * dVar7 +
             dVar19 * dVar1 * dVar4 * dVar2 * dVar88 * dVar7 +
             dVar117 * dVar11 * dVar87 * dVar143 * dVar138 * dVar88 +
             dVar19 * dVar11 * dVar87 * dVar2 * dVar88 * dVar7 +
             dVar132 * dVar19 * dVar87 * dVar143 * dVar29 +
             dVar132 * dVar117 * dVar87 * dVar12 * dVar88 * dVar7 +
             dVar92 * dVar1 * dVar4 * dVar12 * dVar5 * dVar138 +
             dVar4 * dVar54 * dVar1 * dVar2 * dVar5 * dVar88 +
             dVar54 * dVar1 * dVar9 * dVar12 * dVar6 * dVar138 +
             dVar92 * dVar1 * dVar9 * dVar2 * dVar6 * dVar88 +
             dVar54 * dVar11 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar92 * dVar11 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar92 * dVar132 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar54 * dVar132 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar105 * dVar10 * dVar1 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar78 * dVar10 * dVar1 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar78 * dVar47 * dVar1 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar105 * dVar47 * dVar1 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar104 * dVar1 * dVar4 * dVar2 * dVar12 * dVar138 +
             dVar83 * dVar1 * dVar4 * dVar106 * dVar88 +
             dVar83 * dVar1 * dVar9 * dVar95 * dVar138 +
             dVar104 * dVar1 * dVar9 * dVar2 * dVar12 * dVar88 +
             dVar83 * dVar11 * dVar87 * dVar2 * dVar12 * dVar138 +
             dVar104 * dVar11 * dVar87 * dVar106 * dVar88 +
             dVar132 * dVar104 * dVar87 * dVar95 * dVar138 +
             dVar132 * dVar83 * dVar87 * dVar2 * dVar12 * dVar88 +
             dVar107 * dVar30 * dVar11 * dVar9 * dVar6 * dVar138 * dVar7 +
             dVar150 * dVar30 * dVar11 * dVar9 * dVar5 * dVar88 * dVar7 +
             dVar150 * dVar30 * dVar132 * dVar4 * dVar6 * dVar138 * dVar7 +
             dVar107 * dVar30 * dVar132 * dVar4 * dVar5 * dVar88 * dVar7 +
             dVar57 * dVar1 * dVar4 * dVar135 * dVar48 +
             dVar56 * dVar1 * dVar4 * dVar5 * dVar138 * dVar7 +
             dVar56 * dVar1 * dVar9 * dVar135 * dVar138 * dVar88 +
             dVar57 * dVar1 * dVar9 * dVar5 * dVar88 * dVar7 +
             dVar56 * dVar11 * dVar87 * dVar135 * dVar48 +
             dVar57 * dVar11 * dVar87 * dVar5 * dVar138 * dVar7 +
             dVar57 * dVar132 * dVar87 * dVar135 * dVar138 * dVar88 +
             dVar56 * dVar132 * dVar87 * dVar5 * dVar88 * dVar7 +
             dVar153 * dVar1 * dVar4 * dVar135 * dVar138 * dVar88 +
             dVar93 * dVar1 * dVar4 * dVar6 * dVar138 * dVar7 +
             dVar93 * dVar1 * dVar9 * dVar135 * dVar29 +
             dVar153 * dVar1 * dVar9 * dVar6 * dVar88 * dVar7 +
             dVar93 * dVar11 * dVar87 * dVar135 * dVar138 * dVar88 +
             dVar153 * dVar11 * dVar87 * dVar6 * dVar138 * dVar7 +
             dVar153 * dVar132 * dVar87 * dVar135 * dVar29 +
             dVar93 * dVar132 * dVar87 * dVar6 * dVar88 * dVar7 +
             dVar111 * dVar4 * dVar5 * dVar6 * dVar138 +
             dVar113 * dVar4 * dVar28 * dVar88 +
             dVar9 * dVar113 * dVar63 * dVar138 +
             dVar9 * dVar111 * dVar5 * dVar6 * dVar88 +
             dVar15 * dVar10 * dVar1 * dVar87 * dVar5 * dVar6 * dVar138 +
             dVar94 * dVar10 * dVar1 * dVar87 * dVar28 * dVar88 +
             dVar47 * dVar94 * dVar1 * dVar87 * dVar63 * dVar138 +
             dVar47 * dVar15 * dVar1 * dVar87 * dVar5 * dVar6 * dVar88 +
             dVar18 * dVar1 * dVar4 * dVar2 * dVar6 * dVar138 +
             dVar36 * dVar1 * dVar4 * dVar2 * dVar5 * dVar88 +
             dVar36 * dVar1 * dVar9 * dVar12 * dVar6 * dVar138 +
             dVar18 * dVar1 * dVar9 * dVar12 * dVar5 * dVar88 +
             dVar11 * dVar18 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar11 * dVar36 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar36 * dVar132 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar18 * dVar132 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar82 * dVar10 * dVar1 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar16 * dVar10 * dVar1 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar16 * dVar47 * dVar1 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar82 * dVar47 * dVar1 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar119 * dVar30 * dVar11 * dVar87 * dVar5 * dVar6 * dVar138 +
             dVar156 * dVar30 * dVar11 * dVar87 * dVar28 * dVar88 +
             dVar156 * dVar30 * dVar132 * dVar87 * dVar63 * dVar138 +
             dVar119 * dVar30 * dVar132 * dVar87 * dVar5 * dVar6 * dVar88 +
             dVar156 * dVar10 * dVar1 * dVar87 * dVar5 * dVar6 * dVar138 +
             dVar119 * dVar10 * dVar1 * dVar87 * dVar28 * dVar88 +
             dVar47 * dVar119 * dVar1 * dVar87 * dVar63 * dVar138 +
             dVar47 * dVar156 * dVar1 * dVar87 * dVar5 * dVar6 * dVar88 +
             dVar49 * dVar1 * dVar4 * dVar12 * dVar5 * dVar138 +
             dVar103 * dVar1 * dVar4 * dVar2 * dVar6 * dVar138 +
             dVar9 * dVar103 * dVar1 * dVar12 * dVar5 * dVar88 +
             dVar9 * dVar49 * dVar1 * dVar2 * dVar6 * dVar88 +
             dVar11 * dVar49 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar11 * dVar103 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar132 * dVar103 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar132 * dVar49 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar102 * dVar10 * dVar1 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar31 * dVar10 * dVar1 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar47 * dVar31 * dVar1 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar47 * dVar102 * dVar1 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar81 * dVar30 * dVar11 * dVar9 * dVar12 * dVar138 * dVar7 +
             dVar32 * dVar30 * dVar11 * dVar9 * dVar2 * dVar88 * dVar7 +
             dVar32 * dVar30 * dVar132 * dVar4 * dVar12 * dVar138 * dVar7 +
             dVar81 * dVar30 * dVar132 * dVar4 * dVar2 * dVar88 * dVar7 +
             dVar96 * dVar1 * dVar4 * dVar143 * dVar48 +
             dVar24 * dVar1 * dVar4 * dVar2 * dVar138 * dVar7 +
             dVar24 * dVar1 * dVar9 * dVar143 * dVar138 * dVar88 +
             dVar96 * dVar1 * dVar9 * dVar2 * dVar88 * dVar7 +
             dVar24 * dVar11 * dVar87 * dVar143 * dVar48 +
             dVar96 * dVar11 * dVar87 * dVar2 * dVar138 * dVar7 +
             dVar96 * dVar132 * dVar87 * dVar143 * dVar138 * dVar88 +
             dVar24 * dVar132 * dVar87 * dVar2 * dVar88 * dVar7 +
             dVar118 * dVar1 * dVar4 * dVar143 * dVar138 * dVar88 +
             dVar53 * dVar1 * dVar4 * dVar12 * dVar138 * dVar7 +
             dVar53 * dVar1 * dVar9 * dVar143 * dVar29 +
             dVar118 * dVar1 * dVar9 * dVar12 * dVar88 * dVar7 +
             dVar53 * dVar11 * dVar87 * dVar143 * dVar138 * dVar88 +
             dVar118 * dVar11 * dVar87 * dVar12 * dVar138 * dVar7 +
             dVar132 * dVar118 * dVar87 * dVar143 * dVar29 +
             dVar132 * dVar53 * dVar87 * dVar12 * dVar88 * dVar7 +
             dVar17 * dVar1 * dVar4 * dVar12 * dVar5 * dVar138 +
             dVar4 * dVar35 * dVar1 * dVar2 * dVar5 * dVar88 +
             dVar35 * dVar1 * dVar9 * dVar12 * dVar6 * dVar138 +
             dVar17 * dVar1 * dVar9 * dVar2 * dVar6 * dVar88 +
             dVar35 * dVar11 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar17 * dVar11 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar17 * dVar132 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar35 * dVar132 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar101 * dVar10 * dVar1 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar80 * dVar10 * dVar1 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar80 * dVar47 * dVar1 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar101 * dVar47 * dVar1 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar52 * dVar4 * dVar2 * dVar12 * dVar138 +
             dVar125 * dVar4 * dVar106 * dVar88 +
             dVar9 * dVar125 * dVar95 * dVar138 +
             dVar9 * dVar52 * dVar2 * dVar12 * dVar88 +
             dVar51 * dVar10 * dVar1 * dVar87 * dVar2 * dVar12 * dVar138 +
             dVar34 * dVar10 * dVar1 * dVar87 * dVar106 * dVar88 +
             dVar47 * dVar34 * dVar1 * dVar87 * dVar95 * dVar138 +
             dVar47 * dVar51 * dVar1 * dVar87 * dVar2 * dVar12 * dVar88 +
             dVar100 * dVar1 * dVar4 * dVar12 * dVar5 * dVar138 +
             dVar141 * dVar1 * dVar4 * dVar2 * dVar6 * dVar138 +
             dVar141 * dVar1 * dVar9 * dVar12 * dVar5 * dVar88 +
             dVar100 * dVar1 * dVar9 * dVar2 * dVar6 * dVar88 +
             dVar11 * dVar141 * dVar87 * dVar12 * dVar5 * dVar138 +
             dVar11 * dVar100 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar100 * dVar132 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar141 * dVar132 * dVar87 * dVar2 * dVar6 * dVar88 +
             dVar99 * dVar10 * dVar1 * dVar87 * dVar2 * dVar6 * dVar138 +
             dVar140 * dVar10 * dVar1 * dVar87 * dVar2 * dVar5 * dVar88 +
             dVar47 * dVar140 * dVar1 * dVar87 * dVar12 * dVar6 * dVar138 +
             dVar47 * dVar99 * dVar1 * dVar87 * dVar12 * dVar5 * dVar88 +
             dVar8 * dVar30 * dVar11 * dVar87 * dVar2 * dVar12 * dVar138 +
             dVar50 * dVar30 * dVar11 * dVar87 * dVar106 * dVar88 +
             dVar50 * dVar30 * dVar132 * dVar87 * dVar95 * dVar138 +
             dVar8 * dVar30 * dVar132 * dVar87 * dVar2 * dVar12 * dVar88 +
             dVar50 * dVar10 * dVar1 * dVar87 * dVar2 * dVar12 * dVar138 +
             dVar8 * dVar10 * dVar1 * dVar87 * dVar106 * dVar88 +
             dVar50 * dVar47 * dVar1 * dVar87 * dVar2 * dVar12 * dVar88 +
             dVar8 * dVar47 * dVar1 * dVar87 * dVar95 * dVar138;
  local_f8.m_xpr = __return_storage_ptr__;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (&local_f8,&local_18);
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0];
  dVar132 = -dVar143;
  dVar120 = dVar138 * dVar132 * dVar88;
  dVar38 = dVar143 * dVar138 * dVar88;
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xb];
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[8];
  dVar5 = dVar143 * dVar138 * dVar28;
  dVar6 = dVar138 * dVar132 * dVar28;
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[4];
  dVar17 = dVar143 * dVar29;
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar64 = dVar17 * dVar48;
  dVar18 = dVar29 * dVar132;
  dVar121 = dVar18 * dVar48;
  dVar7 = dVar17 * dVar88 * dVar135;
  dVar8 = dVar18 * dVar88 * dVar135;
  dVar17 = dVar17 * dVar28;
  dVar18 = dVar18 * dVar28;
  dVar47 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[5];
  dVar143 = dVar143 * dVar47;
  dVar55 = dVar143 * dVar48;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [9];
  dVar13 = dVar1 * dVar55;
  dVar132 = dVar132 * dVar47;
  dVar57 = dVar132 * dVar48;
  dVar93 = dVar143 * dVar88;
  dVar79 = dVar132 * dVar88;
  dVar87 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[1];
  dVar20 = -dVar87;
  dVar9 = dVar138 * dVar20;
  dVar60 = dVar9 * dVar48 * dVar135;
  dVar19 = dVar87 * dVar138;
  dVar61 = dVar19 * dVar48 * dVar135;
  dVar14 = dVar9 * dVar88;
  dVar62 = dVar19 * dVar88;
  dVar9 = dVar9 * dVar28;
  dVar19 = dVar19 * dVar28;
  dVar39 = dVar87 * dVar29 * dVar48;
  dVar31 = dVar29 * dVar20 * dVar48;
  dVar63 = dVar87 * dVar29 * dVar28;
  dVar147 = dVar29 * dVar20 * dVar28;
  dVar87 = dVar87 * dVar47;
  dVar129 = dVar87 * dVar48;
  dVar20 = dVar20 * dVar47;
  dVar4 = dVar20 * dVar48;
  dVar59 = dVar87 * dVar88;
  dVar49 = dVar1 * dVar59;
  dVar81 = dVar20 * dVar88;
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [2];
  dVar30 = -dVar2;
  dVar10 = dVar2 * dVar138;
  dVar138 = dVar138 * dVar30;
  dVar78 = dVar138 * dVar48;
  dVar82 = dVar10 * dVar48;
  dVar23 = dVar138 * dVar88;
  dVar92 = dVar10 * dVar88;
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[10];
  dVar83 = dVar12 * dVar92;
  dVar84 = dVar12 * dVar23;
  dVar32 = dVar2 * dVar29;
  dVar29 = dVar29 * dVar30;
  dVar27 = dVar29 * dVar48;
  dVar26 = dVar32 * dVar48;
  dVar85 = dVar12 * dVar26;
  dVar86 = dVar12 * dVar27;
  dVar40 = dVar29 * dVar88;
  dVar95 = dVar1 * dVar40;
  dVar96 = dVar32 * dVar88;
  dVar58 = dVar30 * dVar47 * dVar48;
  dVar48 = dVar48 * dVar2 * dVar47;
  dVar65 = dVar30 * dVar47 * dVar88;
  dVar88 = dVar2 * dVar47 * dVar88;
  dVar117 = dVar18 * dVar12;
  dVar128 = dVar17 * dVar12;
  dVar66 = dVar57 * dVar12;
  dVar134 = dVar55 * dVar12;
  dVar152 = dVar79 * dVar12;
  dVar15 = dVar93 * dVar12;
  dVar16 = dVar143 * dVar28 * dVar12;
  dVar98 = dVar1 * dVar132 * dVar28;
  local_58 = dVar132 * dVar28 * dVar12;
  dVar97 = dVar19 * dVar12;
  dVar99 = dVar9 * dVar12;
  dVar100 = dVar129 * dVar12;
  dVar101 = dVar4 * dVar12;
  dVar80 = dVar81 * dVar12;
  dVar102 = dVar59 * dVar12;
  dVar146 = dVar87 * dVar28 * dVar12;
  dVar148 = dVar20 * dVar28 * dVar12;
  dVar157 = dVar82 * dVar12;
  dVar103 = dVar78 * dVar12;
  dVar151 = dVar138 * dVar28 * dVar12;
  dVar114 = dVar1 * dVar10 * dVar28;
  dVar41 = dVar10 * dVar28 * dVar12;
  dVar42 = dVar96 * dVar12;
  dVar43 = dVar40 * dVar12;
  dVar44 = dVar29 * dVar28 * dVar12;
  dVar45 = dVar32 * dVar28 * dVar12;
  dVar47 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xe];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x11];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x12];
  dVar30 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar132 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xc];
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xd];
  dVar104 = dVar6 * dVar135 * dVar11;
  dVar105 = dVar5 * dVar135 * dVar11;
  dVar122 = dVar17 * dVar1;
  dVar106 = dVar18 * dVar1;
  dVar107 = dVar132 * dVar17 * dVar135;
  dVar123 = dVar132 * dVar18 * dVar135;
  dVar89 = dVar17 * dVar135 * dVar11;
  dVar108 = dVar18 * dVar135 * dVar11;
  dVar109 = dVar57 * dVar1;
  dVar110 = dVar55 * dVar135 * dVar11;
  dVar111 = dVar57 * dVar135 * dVar11;
  dVar67 = dVar93 * dVar1;
  dVar68 = dVar79 * dVar1;
  dVar112 = dVar93 * dVar135 * dVar11;
  dVar113 = dVar79 * dVar135 * dVar11;
  local_48 = dVar143 * dVar28 * dVar1;
  uStack_40 = 0;
  uStack_50 = 0x8000000000000000;
  dVar69 = dVar9 * dVar1;
  dVar118 = dVar19 * dVar1;
  dVar119 = dVar132 * dVar19 * dVar135;
  dVar90 = dVar132 * dVar9 * dVar135;
  dVar125 = dVar9 * dVar135 * dVar11;
  dVar70 = dVar19 * dVar135 * dVar11;
  dVar126 = dVar147 * dVar135 * dVar11;
  dVar130 = dVar63 * dVar135 * dVar11;
  dVar71 = dVar129 * dVar1;
  dVar72 = dVar4 * dVar1;
  dVar131 = dVar129 * dVar135 * dVar11;
  dVar136 = dVar4 * dVar135 * dVar11;
  dVar137 = dVar81 * dVar1;
  dVar17 = dVar59 * dVar135 * dVar11;
  dVar18 = dVar81 * dVar135 * dVar11;
  dVar19 = dVar20 * dVar28 * dVar1;
  dVar140 = dVar87 * dVar28 * dVar1;
  dVar20 = dVar78 * dVar1;
  dVar141 = dVar82 * dVar1;
  dVar21 = dVar23 * dVar1;
  dVar22 = dVar92 * dVar1;
  dVar142 = dVar132 * dVar92 * dVar135;
  dVar73 = dVar132 * dVar23 * dVar135;
  dVar145 = dVar23 * dVar135 * dVar11;
  dVar92 = dVar92 * dVar135 * dVar11;
  dVar23 = dVar138 * dVar28 * dVar1;
  dVar24 = dVar27 * dVar1;
  dVar144 = dVar26 * dVar1;
  dVar25 = dVar132 * dVar27 * dVar135;
  dVar74 = dVar132 * dVar26 * dVar135;
  dVar26 = dVar26 * dVar135 * dVar11;
  dVar150 = dVar27 * dVar135 * dVar11;
  dVar27 = dVar96 * dVar1;
  dVar32 = dVar32 * dVar28 * dVar1;
  dVar154 = dVar29 * dVar28 * dVar1;
  dVar33 = dVar58 * dVar1 * dVar11;
  dVar34 = dVar48 * dVar1 * dVar11;
  dVar35 = dVar65 * dVar1 * dVar11;
  dVar133 = dVar1 * dVar88 * dVar11;
  dVar75 = dVar6 * dVar1 * dVar47;
  dVar91 = dVar5 * dVar1 * dVar47;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xf];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x10];
  dVar36 = dVar6 * dVar12 * dVar47;
  dVar37 = dVar121 * dVar135 * dVar47;
  dVar76 = dVar64 * dVar135 * dVar47;
  dVar50 = dVar62 * dVar135 * dVar47;
  dVar139 = dVar14 * dVar135 * dVar47;
  dVar51 = dVar147 * dVar1 * dVar47;
  dVar52 = dVar63 * dVar1 * dVar47;
  dVar53 = dVar147 * dVar12 * dVar47;
  dVar127 = dVar47 * dVar5 * dVar12;
  dVar158 = dVar5 * dVar135 * dVar132;
  dVar54 = dVar6 * dVar135 * dVar132;
  dVar55 = dVar55 * dVar135 * dVar132;
  local_a8 = dVar55 * dVar138 * dVar30;
  uStack_a0 = 0;
  local_98 = dVar68 * dVar47 * dVar138 * dVar30;
  uStack_90 = 0x8000000000000000;
  dVar94 = dVar79 * dVar135 * dVar132;
  dVar93 = dVar93 * dVar135 * dVar132;
  local_88 = dVar118 * dVar47 * dVar138 * dVar30;
  uStack_80 = 0;
  local_78 = dVar71 * dVar47 * dVar138 * dVar30;
  uStack_70 = 0;
  dVar153 = dVar4 * dVar135 * dVar132;
  local_68 = dVar157 * dVar47 * dVar138 * dVar30;
  uStack_60 = 0;
  dVar56 = dVar48 * dVar12 * dVar132;
  dVar149 = dVar30 * dVar30;
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x16];
  dVar57 = dVar57 * dVar135 * dVar132;
  dVar155 = dVar129 * dVar135 * dVar132;
  dVar129 = dVar58 * dVar12 * dVar132;
  dVar124 = dVar10 * dVar10;
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar46 = dVar47 * dVar63 * dVar12;
  dVar58 = dVar147 * dVar135 * dVar132;
  dVar59 = dVar59 * dVar135 * dVar132;
  dVar77 = dVar29 * dVar29;
  dVar87 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x17];
  dVar79 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x18];
  dVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x1a];
  dVar115 = dVar63 * dVar135 * dVar132;
  dVar116 = dVar28 * dVar28;
  local_d8 = dVar42 * dVar47 * dVar138 * dVar28;
  uStack_d0 = 0;
  local_b8 = dVar35 * dVar138 * dVar28;
  uStack_b0 = 0x8000000000000000;
  dVar156 = dVar88 * dVar12 * dVar132;
  local_c8 = dVar156 * dVar138 * dVar28;
  uStack_c0 = 0;
  dVar81 = dVar81 * dVar135 * dVar132;
  dVar65 = dVar65 * dVar12 * dVar132;
  dVar88 = dVar4 * dVar4;
  local_20 = dVar156 * dVar143 * dVar87 * dVar9 * dVar4 +
             dVar65 * dVar143 * dVar29 * dVar88 +
             dVar138 * dVar65 * dVar87 * dVar79 * dVar4 +
             local_c8 * dVar88 +
             dVar35 * dVar143 * dVar87 * dVar9 * dVar4 +
             dVar133 * dVar143 * dVar29 * dVar88 +
             dVar133 * dVar138 * dVar87 * dVar79 * dVar4 +
             local_b8 * dVar88 +
             dVar56 * dVar143 * dVar48 * dVar9 * dVar4 +
             dVar129 * dVar143 * dVar10 * dVar88 +
             dVar129 * dVar138 * dVar48 * dVar79 * dVar4 +
             dVar56 * dVar138 * dVar30 * dVar88 +
             dVar33 * dVar143 * dVar48 * dVar9 * dVar4 +
             dVar34 * dVar143 * dVar10 * dVar88 +
             dVar34 * dVar138 * dVar48 * dVar79 * dVar4 +
             dVar138 * dVar33 * dVar30 * dVar88 +
             dVar44 * dVar11 * dVar138 * dVar87 * dVar9 * dVar4 +
             dVar45 * dVar11 * dVar138 * dVar29 * dVar88 +
             dVar45 * dVar132 * dVar138 * dVar87 * dVar79 * dVar4 +
             dVar44 * dVar132 * dVar138 * dVar28 * dVar88 +
             dVar32 * dVar11 * dVar143 * dVar87 * dVar9 * dVar4 +
             dVar154 * dVar11 * dVar143 * dVar29 * dVar88 +
             dVar154 * dVar132 * dVar143 * dVar87 * dVar79 * dVar4 +
             dVar132 * dVar32 * dVar143 * dVar28 * dVar88 +
             dVar96 * dVar135 * dVar11 * dVar138 * dVar28 * dVar87 * dVar9 +
             dVar40 * dVar135 * dVar11 * dVar138 * dVar29 * dVar87 * dVar79 +
             dVar40 * dVar135 * dVar132 * dVar143 * dVar28 * dVar87 * dVar9 +
             dVar96 * dVar135 * dVar132 * dVar143 * dVar29 * dVar87 * dVar79 +
             dVar43 * dVar47 * dVar143 * dVar29 * dVar87 * dVar9 +
             dVar42 * dVar47 * dVar143 * dVar77 * dVar4 +
             local_d8 * dVar87 * dVar9 +
             dVar43 * dVar47 * dVar138 * dVar29 * dVar28 * dVar4 +
             dVar42 * dVar11 * dVar2 * dVar29 * dVar87 * dVar9 +
             dVar43 * dVar11 * dVar2 * dVar77 * dVar4 +
             dVar43 * dVar132 * dVar2 * dVar28 * dVar87 * dVar9 +
             dVar42 * dVar132 * dVar2 * dVar29 * dVar28 * dVar4 +
             dVar27 * dVar47 * dVar143 * dVar29 * dVar87 * dVar79 +
             dVar95 * dVar47 * dVar143 * dVar29 * dVar28 * dVar4 +
             dVar95 * dVar47 * dVar138 * dVar28 * dVar87 * dVar79 +
             dVar27 * dVar47 * dVar138 * dVar116 * dVar4 +
             dVar95 * dVar11 * dVar2 * dVar29 * dVar87 * dVar79 +
             dVar27 * dVar11 * dVar2 * dVar29 * dVar28 * dVar4 +
             dVar27 * dVar132 * dVar2 * dVar28 * dVar87 * dVar79 +
             dVar132 * dVar95 * dVar2 * dVar116 * dVar4 +
             dVar26 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar150 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar138 * dVar150 * dVar48 * dVar29 * dVar79 +
             dVar138 * dVar26 * dVar30 * dVar87 * dVar9 +
             dVar25 * dVar143 * dVar48 * dVar28 * dVar9 +
             dVar74 * dVar143 * dVar10 * dVar87 * dVar79 +
             dVar138 * dVar74 * dVar48 * dVar28 * dVar79 +
             dVar138 * dVar25 * dVar30 * dVar87 * dVar79 +
             dVar86 * dVar47 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar85 * dVar47 * dVar143 * dVar10 * dVar29 * dVar4 +
             dVar138 * dVar85 * dVar47 * dVar48 * dVar28 * dVar9 +
             dVar138 * dVar86 * dVar47 * dVar30 * dVar29 * dVar4 +
             dVar11 * dVar85 * dVar2 * dVar10 * dVar87 * dVar9 +
             dVar11 * dVar86 * dVar2 * dVar10 * dVar29 * dVar4 +
             dVar86 * dVar132 * dVar2 * dVar30 * dVar87 * dVar9 +
             dVar85 * dVar132 * dVar2 * dVar10 * dVar28 * dVar4 +
             dVar144 * dVar47 * dVar143 * dVar48 * dVar29 * dVar79 +
             dVar24 * dVar47 * dVar143 * dVar10 * dVar28 * dVar4 +
             dVar138 * dVar24 * dVar47 * dVar48 * dVar28 * dVar79 +
             dVar138 * dVar144 * dVar47 * dVar30 * dVar28 * dVar4 +
             dVar11 * dVar144 * dVar2 * dVar30 * dVar29 * dVar4 +
             dVar11 * dVar24 * dVar2 * dVar10 * dVar87 * dVar79 +
             dVar144 * dVar132 * dVar2 * dVar30 * dVar87 * dVar79 +
             dVar24 * dVar132 * dVar2 * dVar30 * dVar28 * dVar4 +
             dVar151 * dVar11 * dVar138 * dVar48 * dVar9 * dVar4 +
             dVar41 * dVar11 * dVar138 * dVar10 * dVar88 +
             dVar41 * dVar132 * dVar138 * dVar48 * dVar79 * dVar4 +
             dVar151 * dVar132 * dVar138 * dVar30 * dVar88 +
             dVar114 * dVar11 * dVar143 * dVar48 * dVar9 * dVar4 +
             dVar23 * dVar11 * dVar143 * dVar10 * dVar88 +
             dVar23 * dVar132 * dVar143 * dVar48 * dVar79 * dVar4 +
             dVar132 * dVar114 * dVar143 * dVar30 * dVar88 +
             dVar145 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar92 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar138 * dVar92 * dVar48 * dVar28 * dVar9 +
             dVar138 * dVar145 * dVar10 * dVar87 * dVar79 +
             dVar142 * dVar143 * dVar48 * dVar29 * dVar79 +
             dVar73 * dVar143 * dVar30 * dVar87 * dVar9 +
             dVar138 * dVar73 * dVar48 * dVar28 * dVar79 +
             dVar138 * dVar142 * dVar30 * dVar87 * dVar79 +
             dVar84 * dVar47 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar83 * dVar47 * dVar143 * dVar10 * dVar29 * dVar4 +
             dVar138 * dVar83 * dVar47 * dVar30 * dVar87 * dVar9 +
             dVar138 * dVar84 * dVar47 * dVar10 * dVar28 * dVar4 +
             dVar11 * dVar83 * dVar2 * dVar48 * dVar29 * dVar9 +
             dVar11 * dVar84 * dVar2 * dVar10 * dVar29 * dVar4 +
             dVar132 * dVar84 * dVar2 * dVar48 * dVar28 * dVar9 +
             dVar132 * dVar83 * dVar2 * dVar30 * dVar29 * dVar4 +
             dVar21 * dVar47 * dVar143 * dVar30 * dVar29 * dVar4 +
             dVar22 * dVar47 * dVar143 * dVar10 * dVar87 * dVar79 +
             dVar138 * dVar21 * dVar47 * dVar30 * dVar87 * dVar79 +
             dVar138 * dVar22 * dVar47 * dVar30 * dVar28 * dVar4 +
             dVar11 * dVar21 * dVar2 * dVar48 * dVar29 * dVar79 +
             dVar11 * dVar22 * dVar2 * dVar10 * dVar28 * dVar4 +
             dVar132 * dVar22 * dVar2 * dVar48 * dVar28 * dVar79 +
             dVar132 * dVar21 * dVar2 * dVar30 * dVar28 * dVar4 +
             dVar82 * dVar135 * dVar11 * dVar138 * dVar30 * dVar48 * dVar9 +
             dVar78 * dVar135 * dVar11 * dVar138 * dVar10 * dVar48 * dVar79 +
             dVar78 * dVar135 * dVar132 * dVar143 * dVar30 * dVar48 * dVar9 +
             dVar82 * dVar135 * dVar132 * dVar143 * dVar10 * dVar48 * dVar79 +
             dVar103 * dVar47 * dVar143 * dVar10 * dVar48 * dVar9 +
             dVar157 * dVar47 * dVar143 * dVar124 * dVar4 +
             local_68 * dVar48 * dVar9 +
             dVar103 * dVar47 * dVar138 * dVar10 * dVar30 * dVar4 +
             dVar157 * dVar11 * dVar2 * dVar10 * dVar48 * dVar9 +
             dVar103 * dVar11 * dVar2 * dVar124 * dVar4 +
             dVar103 * dVar132 * dVar2 * dVar30 * dVar48 * dVar9 +
             dVar157 * dVar132 * dVar2 * dVar10 * dVar30 * dVar4 +
             dVar141 * dVar47 * dVar143 * dVar10 * dVar48 * dVar79 +
             dVar20 * dVar47 * dVar143 * dVar10 * dVar30 * dVar4 +
             dVar20 * dVar47 * dVar138 * dVar30 * dVar48 * dVar79 +
             dVar141 * dVar47 * dVar138 * dVar149 * dVar4 +
             dVar20 * dVar11 * dVar2 * dVar10 * dVar48 * dVar79 +
             dVar141 * dVar11 * dVar2 * dVar10 * dVar30 * dVar4 +
             dVar141 * dVar132 * dVar2 * dVar30 * dVar48 * dVar79 +
             dVar20 * dVar132 * dVar2 * dVar149 * dVar4 +
             dVar146 * dVar11 * dVar138 * dVar87 * dVar9 * dVar4 +
             dVar148 * dVar11 * dVar138 * dVar29 * dVar88 +
             dVar148 * dVar132 * dVar143 * dVar87 * dVar9 * dVar4 +
             dVar146 * dVar132 * dVar143 * dVar29 * dVar88 +
             dVar19 * dVar11 * dVar138 * dVar87 * dVar79 * dVar4 +
             dVar140 * dVar11 * dVar138 * dVar28 * dVar88 +
             dVar140 * dVar132 * dVar143 * dVar87 * dVar79 * dVar4 +
             dVar19 * dVar132 * dVar143 * dVar28 * dVar88 +
             dVar17 * dVar143 * dVar29 * dVar87 * dVar9 +
             dVar18 * dVar143 * dVar77 * dVar4 +
             dVar138 * dVar18 * dVar28 * dVar87 * dVar9 +
             dVar138 * dVar17 * dVar29 * dVar28 * dVar4 +
             dVar81 * dVar143 * dVar29 * dVar87 * dVar79 +
             dVar59 * dVar143 * dVar29 * dVar28 * dVar4 +
             dVar59 * dVar138 * dVar28 * dVar87 * dVar79 +
             dVar138 * dVar81 * dVar116 * dVar4 +
             dVar80 * dVar47 * dVar138 * dVar28 * dVar87 * dVar9 +
             dVar102 * dVar47 * dVar138 * dVar29 * dVar87 * dVar79 +
             dVar80 * dVar11 * dVar2 * dVar29 * dVar87 * dVar9 +
             dVar11 * dVar102 * dVar2 * dVar77 * dVar4 +
             dVar132 * dVar102 * dVar2 * dVar29 * dVar87 * dVar79 +
             dVar132 * dVar80 * dVar2 * dVar29 * dVar28 * dVar4 +
             dVar49 * dVar47 * dVar143 * dVar28 * dVar87 * dVar9 +
             dVar137 * dVar47 * dVar143 * dVar29 * dVar87 * dVar79 +
             dVar49 * dVar11 * dVar2 * dVar28 * dVar87 * dVar9 +
             dVar137 * dVar11 * dVar2 * dVar29 * dVar28 * dVar4 +
             dVar137 * dVar132 * dVar2 * dVar28 * dVar87 * dVar79 +
             dVar132 * dVar49 * dVar2 * dVar116 * dVar4 +
             dVar131 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar143 * dVar136 * dVar10 * dVar29 * dVar4 +
             dVar136 * dVar138 * dVar48 * dVar28 * dVar9 +
             dVar131 * dVar138 * dVar30 * dVar29 * dVar4 +
             dVar153 * dVar143 * dVar48 * dVar29 * dVar79 +
             dVar143 * dVar155 * dVar10 * dVar28 * dVar4 +
             dVar155 * dVar138 * dVar48 * dVar28 * dVar79 +
             dVar153 * dVar138 * dVar30 * dVar28 * dVar4 +
             dVar101 * dVar47 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar100 * dVar47 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar138 * dVar100 * dVar47 * dVar48 * dVar29 * dVar79 +
             dVar138 * dVar101 * dVar47 * dVar30 * dVar87 * dVar9 +
             dVar11 * dVar101 * dVar2 * dVar10 * dVar87 * dVar9 +
             dVar11 * dVar100 * dVar2 * dVar10 * dVar29 * dVar4 +
             dVar132 * dVar101 * dVar2 * dVar30 * dVar29 * dVar4 +
             dVar132 * dVar100 * dVar2 * dVar10 * dVar87 * dVar79 +
             dVar71 * dVar47 * dVar143 * dVar48 * dVar28 * dVar9 +
             dVar143 * dVar72 * dVar47 * dVar10 * dVar87 * dVar79 +
             dVar72 * dVar47 * dVar138 * dVar48 * dVar28 * dVar79 +
             local_78 * dVar87 * dVar79 +
             dVar11 * dVar71 * dVar2 * dVar30 * dVar87 * dVar9 +
             dVar11 * dVar72 * dVar2 * dVar10 * dVar28 * dVar4 +
             dVar72 * dVar132 * dVar2 * dVar30 * dVar87 * dVar79 +
             dVar71 * dVar132 * dVar2 * dVar30 * dVar28 * dVar4 +
             dVar126 * dVar143 * dVar29 * dVar87 * dVar9 +
             dVar130 * dVar143 * dVar77 * dVar4 +
             dVar138 * dVar130 * dVar29 * dVar87 * dVar79 +
             dVar138 * dVar126 * dVar29 * dVar28 * dVar4 +
             dVar115 * dVar143 * dVar28 * dVar87 * dVar9 +
             dVar58 * dVar143 * dVar29 * dVar28 * dVar4 +
             dVar58 * dVar138 * dVar28 * dVar87 * dVar79 +
             dVar115 * dVar138 * dVar116 * dVar4 +
             dVar46 * dVar143 * dVar29 * dVar87 * dVar9 +
             dVar53 * dVar143 * dVar77 * dVar4 +
             dVar138 * dVar53 * dVar29 * dVar87 * dVar79 +
             dVar138 * dVar46 * dVar29 * dVar28 * dVar4 +
             dVar63 * dVar12 * dVar132 * dVar2 * dVar28 * dVar87 * dVar9 +
             dVar147 * dVar12 * dVar132 * dVar2 * dVar29 * dVar87 * dVar79 +
             dVar51 * dVar143 * dVar28 * dVar87 * dVar9 +
             dVar52 * dVar143 * dVar29 * dVar28 * dVar4 +
             dVar52 * dVar138 * dVar28 * dVar87 * dVar79 +
             dVar51 * dVar138 * dVar116 * dVar4 +
             dVar147 * dVar1 * dVar11 * dVar2 * dVar28 * dVar87 * dVar9 +
             dVar63 * dVar1 * dVar11 * dVar2 * dVar29 * dVar87 * dVar79 +
             dVar31 * dVar135 * dVar11 * dVar2 * dVar30 * dVar77 +
             dVar39 * dVar135 * dVar11 * dVar2 * dVar10 * dVar29 * dVar28 +
             dVar39 * dVar135 * dVar132 * dVar2 * dVar30 * dVar29 * dVar28 +
             dVar31 * dVar135 * dVar132 * dVar2 * dVar10 * dVar116 +
             dVar39 * dVar12 * dVar47 * dVar2 * dVar30 * dVar77 +
             dVar31 * dVar12 * dVar47 * dVar2 * dVar10 * dVar29 * dVar28 +
             dVar31 * dVar1 * dVar47 * dVar2 * dVar30 * dVar29 * dVar28 +
             dVar1 * dVar39 * dVar47 * dVar2 * dVar10 * dVar116 +
             dVar125 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar70 * dVar143 * dVar10 * dVar29 * dVar4 +
             dVar138 * dVar70 * dVar48 * dVar29 * dVar79 +
             dVar138 * dVar125 * dVar10 * dVar28 * dVar4 +
             dVar119 * dVar143 * dVar48 * dVar28 * dVar9 +
             dVar90 * dVar143 * dVar30 * dVar29 * dVar4 +
             dVar138 * dVar90 * dVar48 * dVar28 * dVar79 +
             dVar138 * dVar119 * dVar30 * dVar28 * dVar4 +
             dVar97 * dVar47 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar99 * dVar47 * dVar143 * dVar10 * dVar29 * dVar4 +
             dVar138 * dVar97 * dVar47 * dVar30 * dVar29 * dVar4 +
             dVar138 * dVar99 * dVar47 * dVar10 * dVar87 * dVar79 +
             dVar11 * dVar97 * dVar2 * dVar48 * dVar29 * dVar9 +
             dVar11 * dVar99 * dVar2 * dVar10 * dVar87 * dVar9 +
             dVar132 * dVar99 * dVar2 * dVar48 * dVar29 * dVar79 +
             dVar132 * dVar97 * dVar2 * dVar30 * dVar87 * dVar9 +
             dVar69 * dVar47 * dVar143 * dVar30 * dVar87 * dVar9 +
             dVar118 * dVar47 * dVar143 * dVar10 * dVar28 * dVar4 +
             local_88 * dVar87 * dVar79 +
             dVar69 * dVar47 * dVar138 * dVar30 * dVar28 * dVar4 +
             dVar69 * dVar11 * dVar2 * dVar48 * dVar28 * dVar9 +
             dVar118 * dVar11 * dVar2 * dVar10 * dVar87 * dVar79 +
             dVar118 * dVar132 * dVar2 * dVar48 * dVar28 * dVar79 +
             dVar69 * dVar132 * dVar2 * dVar30 * dVar87 * dVar79 +
             dVar50 * dVar143 * dVar30 * dVar77 +
             dVar139 * dVar143 * dVar10 * dVar29 * dVar28 +
             dVar139 * dVar138 * dVar30 * dVar29 * dVar28 +
             dVar50 * dVar138 * dVar10 * dVar116 +
             dVar14 * dVar12 * dVar47 * dVar2 * dVar30 * dVar77 +
             dVar62 * dVar12 * dVar47 * dVar2 * dVar10 * dVar29 * dVar28 +
             dVar62 * dVar1 * dVar47 * dVar2 * dVar30 * dVar29 * dVar28 +
             dVar14 * dVar1 * dVar47 * dVar2 * dVar10 * dVar116 +
             dVar61 * dVar47 * dVar143 * dVar10 * dVar30 * dVar29 +
             dVar60 * dVar47 * dVar143 * dVar124 * dVar28 +
             dVar60 * dVar47 * dVar138 * dVar149 * dVar29 +
             dVar61 * dVar47 * dVar138 * dVar10 * dVar30 * dVar28 +
             dVar60 * dVar11 * dVar2 * dVar10 * dVar30 * dVar29 +
             dVar61 * dVar11 * dVar2 * dVar124 * dVar28 +
             dVar61 * dVar132 * dVar2 * dVar149 * dVar29 +
             dVar60 * dVar132 * dVar2 * dVar10 * dVar30 * dVar28 +
             dVar16 * dVar11 * dVar138 * dVar48 * dVar9 * dVar4 +
             local_58 * dVar11 * dVar138 * dVar10 * dVar88 +
             local_58 * dVar132 * dVar143 * dVar48 * dVar9 * dVar4 +
             dVar16 * dVar132 * dVar143 * dVar10 * dVar88 +
             dVar98 * dVar11 * dVar138 * dVar48 * dVar79 * dVar4 +
             local_48 * dVar11 * dVar138 * dVar30 * dVar88 +
             local_48 * dVar132 * dVar143 * dVar48 * dVar79 * dVar4 +
             dVar132 * dVar98 * dVar143 * dVar30 * dVar88 +
             dVar112 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar143 * dVar113 * dVar10 * dVar29 * dVar4 +
             dVar113 * dVar138 * dVar30 * dVar87 * dVar9 +
             dVar112 * dVar138 * dVar10 * dVar28 * dVar4 +
             dVar143 * dVar93 * dVar30 * dVar29 * dVar4 +
             dVar94 * dVar143 * dVar10 * dVar87 * dVar79 +
             dVar93 * dVar138 * dVar30 * dVar87 * dVar79 +
             dVar94 * dVar138 * dVar30 * dVar28 * dVar4 +
             dVar15 * dVar47 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar152 * dVar47 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar138 * dVar152 * dVar47 * dVar48 * dVar28 * dVar9 +
             dVar138 * dVar15 * dVar47 * dVar10 * dVar87 * dVar79 +
             dVar11 * dVar152 * dVar2 * dVar48 * dVar29 * dVar9 +
             dVar11 * dVar15 * dVar2 * dVar10 * dVar29 * dVar4 +
             dVar132 * dVar15 * dVar2 * dVar48 * dVar29 * dVar79 +
             dVar132 * dVar152 * dVar2 * dVar10 * dVar28 * dVar4 +
             dVar68 * dVar47 * dVar143 * dVar48 * dVar29 * dVar79 +
             dVar143 * dVar67 * dVar47 * dVar30 * dVar87 * dVar9 +
             dVar67 * dVar47 * dVar138 * dVar48 * dVar28 * dVar79 +
             local_98 * dVar87 * dVar79 +
             dVar11 * dVar67 * dVar2 * dVar48 * dVar28 * dVar9 +
             dVar11 * dVar68 * dVar2 * dVar30 * dVar29 * dVar4 +
             dVar68 * dVar132 * dVar2 * dVar48 * dVar28 * dVar79 +
             dVar67 * dVar132 * dVar2 * dVar30 * dVar28 * dVar4 +
             dVar110 * dVar143 * dVar10 * dVar48 * dVar9 +
             dVar111 * dVar143 * dVar124 * dVar4 +
             dVar138 * dVar111 * dVar30 * dVar48 * dVar9 +
             dVar138 * dVar110 * dVar10 * dVar30 * dVar4 +
             dVar57 * dVar143 * dVar10 * dVar48 * dVar79 +
             dVar55 * dVar143 * dVar10 * dVar30 * dVar4 +
             local_a8 * dVar48 * dVar79 +
             dVar138 * dVar57 * dVar149 * dVar4 +
             dVar66 * dVar47 * dVar138 * dVar30 * dVar48 * dVar9 +
             dVar134 * dVar47 * dVar138 * dVar10 * dVar48 * dVar79 +
             dVar66 * dVar11 * dVar2 * dVar10 * dVar48 * dVar9 +
             dVar11 * dVar134 * dVar2 * dVar124 * dVar4 +
             dVar132 * dVar134 * dVar2 * dVar10 * dVar48 * dVar79 +
             dVar132 * dVar66 * dVar2 * dVar10 * dVar30 * dVar4 +
             dVar13 * dVar47 * dVar143 * dVar30 * dVar48 * dVar9 +
             dVar109 * dVar47 * dVar143 * dVar10 * dVar48 * dVar79 +
             dVar13 * dVar11 * dVar2 * dVar30 * dVar48 * dVar9 +
             dVar109 * dVar11 * dVar2 * dVar10 * dVar30 * dVar4 +
             dVar109 * dVar132 * dVar2 * dVar30 * dVar48 * dVar79 +
             dVar132 * dVar13 * dVar2 * dVar149 * dVar4 +
             dVar108 * dVar143 * dVar10 * dVar87 * dVar9 +
             dVar89 * dVar143 * dVar10 * dVar29 * dVar4 +
             dVar138 * dVar108 * dVar30 * dVar29 * dVar4 +
             dVar138 * dVar89 * dVar10 * dVar87 * dVar79 +
             dVar107 * dVar143 * dVar30 * dVar87 * dVar9 +
             dVar123 * dVar143 * dVar10 * dVar28 * dVar4 +
             dVar138 * dVar123 * dVar30 * dVar87 * dVar79 +
             dVar138 * dVar107 * dVar30 * dVar28 * dVar4 +
             dVar128 * dVar47 * dVar143 * dVar48 * dVar29 * dVar9 +
             dVar117 * dVar47 * dVar143 * dVar10 * dVar29 * dVar4 +
             dVar138 * dVar117 * dVar47 * dVar48 * dVar29 * dVar79 +
             dVar138 * dVar128 * dVar47 * dVar10 * dVar28 * dVar4 +
             dVar11 * dVar117 * dVar2 * dVar48 * dVar29 * dVar9 +
             dVar11 * dVar128 * dVar2 * dVar10 * dVar87 * dVar9 +
             dVar132 * dVar128 * dVar2 * dVar48 * dVar28 * dVar9 +
             dVar132 * dVar117 * dVar2 * dVar10 * dVar87 * dVar79 +
             dVar106 * dVar47 * dVar143 * dVar48 * dVar28 * dVar9 +
             dVar122 * dVar47 * dVar143 * dVar30 * dVar29 * dVar4 +
             dVar122 * dVar47 * dVar138 * dVar48 * dVar28 * dVar79 +
             dVar106 * dVar47 * dVar138 * dVar30 * dVar28 * dVar4 +
             dVar122 * dVar11 * dVar2 * dVar48 * dVar29 * dVar79 +
             dVar106 * dVar11 * dVar2 * dVar30 * dVar87 * dVar9 +
             dVar106 * dVar132 * dVar2 * dVar48 * dVar28 * dVar79 +
             dVar122 * dVar132 * dVar2 * dVar30 * dVar87 * dVar79 +
             dVar8 * dVar47 * dVar143 * dVar30 * dVar77 +
             dVar7 * dVar47 * dVar143 * dVar10 * dVar29 * dVar28 +
             dVar7 * dVar47 * dVar138 * dVar30 * dVar29 * dVar28 +
             dVar8 * dVar47 * dVar138 * dVar10 * dVar116 +
             dVar7 * dVar11 * dVar2 * dVar30 * dVar77 +
             dVar8 * dVar11 * dVar2 * dVar10 * dVar29 * dVar28 +
             dVar8 * dVar132 * dVar2 * dVar30 * dVar29 * dVar28 +
             dVar132 * dVar7 * dVar2 * dVar10 * dVar116 +
             dVar37 * dVar143 * dVar10 * dVar30 * dVar29 +
             dVar76 * dVar143 * dVar124 * dVar28 +
             dVar138 * dVar76 * dVar149 * dVar29 +
             dVar138 * dVar37 * dVar10 * dVar30 * dVar28 +
             dVar64 * dVar12 * dVar47 * dVar2 * dVar10 * dVar30 * dVar29 +
             dVar121 * dVar12 * dVar47 * dVar2 * dVar124 * dVar28 +
             dVar121 * dVar1 * dVar47 * dVar2 * dVar149 * dVar29 +
             dVar64 * dVar1 * dVar47 * dVar2 * dVar10 * dVar30 * dVar28 +
             dVar104 * dVar143 * dVar10 * dVar48 * dVar9 +
             dVar105 * dVar143 * dVar124 * dVar4 +
             dVar138 * dVar105 * dVar10 * dVar48 * dVar79 +
             dVar138 * dVar104 * dVar10 * dVar30 * dVar4 +
             dVar158 * dVar143 * dVar30 * dVar48 * dVar9 +
             dVar54 * dVar143 * dVar10 * dVar30 * dVar4 +
             dVar54 * dVar138 * dVar30 * dVar48 * dVar79 +
             dVar158 * dVar138 * dVar149 * dVar4 +
             dVar127 * dVar143 * dVar10 * dVar48 * dVar9 +
             dVar36 * dVar143 * dVar124 * dVar4 +
             dVar138 * dVar36 * dVar10 * dVar48 * dVar79 +
             dVar138 * dVar127 * dVar10 * dVar30 * dVar4 +
             dVar5 * dVar12 * dVar132 * dVar2 * dVar30 * dVar48 * dVar9 +
             dVar6 * dVar12 * dVar132 * dVar2 * dVar10 * dVar48 * dVar79 +
             dVar75 * dVar143 * dVar30 * dVar48 * dVar9 +
             dVar91 * dVar143 * dVar10 * dVar30 * dVar4 +
             dVar91 * dVar138 * dVar30 * dVar48 * dVar79 +
             dVar75 * dVar138 * dVar149 * dVar4 +
             dVar11 * dVar6 * dVar1 * dVar2 * dVar30 * dVar48 * dVar9 +
             dVar11 * dVar5 * dVar1 * dVar2 * dVar10 * dVar48 * dVar79 +
             dVar38 * dVar135 * dVar11 * dVar2 * dVar10 * dVar30 * dVar29 +
             dVar120 * dVar135 * dVar11 * dVar2 * dVar124 * dVar28 +
             dVar120 * dVar135 * dVar132 * dVar2 * dVar149 * dVar29 +
             dVar38 * dVar135 * dVar132 * dVar2 * dVar10 * dVar30 * dVar28 +
             dVar120 * dVar12 * dVar47 * dVar2 * dVar10 * dVar30 * dVar29 +
             dVar38 * dVar12 * dVar47 * dVar2 * dVar124 * dVar28 +
             dVar120 * dVar1 * dVar47 * dVar2 * dVar10 * dVar30 * dVar28 +
             dVar38 * dVar1 * dVar47 * dVar2 * dVar149 * dVar29;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar3,&local_20);
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[9];
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xd];
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x11];
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x12];
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0];
  dVar13 = dVar48 * dVar138 * dVar88;
  dVar47 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar32 = -dVar48;
  dVar56 = dVar138 * dVar32 * dVar88;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x13];
  dVar87 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x16];
  dVar12 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xb];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[4];
  dVar93 = dVar48 * dVar10;
  dVar30 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar27 = dVar93 * dVar30;
  dVar132 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[1];
  dVar55 = dVar132 * dVar138;
  dVar11 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[2];
  dVar37 = dVar138 * -dVar11;
  dVar70 = -dVar11 * dVar10;
  dVar51 = dVar10 * dVar32;
  dVar14 = dVar51 * dVar30;
  dVar57 = dVar93 * dVar88;
  dVar31 = dVar51 * dVar88;
  dVar141 = -dVar132;
  dVar100 = dVar138 * dVar141;
  dVar129 = dVar100 * dVar30;
  dVar106 = dVar143 * dVar129;
  dVar107 = dVar55 * dVar30;
  dVar54 = dVar100 * dVar88;
  dVar153 = dVar55 * dVar88;
  dVar58 = dVar10 * dVar141 * dVar30;
  dVar90 = dVar132 * dVar10 * dVar30;
  dVar79 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[5];
  dVar9 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xe];
  dVar91 = dVar56 * dVar143 * dVar9;
  dVar4 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xf];
  dVar59 = dVar13 * dVar143 * dVar9;
  dVar5 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x10];
  dVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [10];
  dVar49 = dVar56 * dVar6 * dVar9;
  dVar71 = dVar27 * dVar143;
  dVar115 = dVar14 * dVar143;
  dVar78 = dVar14 * dVar6;
  dVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xc];
  dVar60 = dVar27 * dVar6;
  dVar92 = dVar57 * dVar143;
  dVar116 = dVar31 * dVar143;
  dVar117 = dVar31 * dVar6;
  dVar61 = dVar57 * dVar6;
  dVar128 = dVar107 * dVar143;
  dVar65 = dVar107 * dVar6;
  dVar134 = dVar129 * dVar6;
  dVar152 = dVar54 * dVar143;
  dVar72 = dVar153 * dVar143;
  dVar15 = dVar153 * dVar6;
  dVar73 = dVar54 * dVar6;
  dVar43 = dVar143 * dVar90 * dVar9;
  dVar16 = dVar143 * dVar58 * dVar9;
  dVar80 = dVar90 * dVar6 * dVar9;
  dVar67 = dVar9 * dVar13 * dVar6;
  dVar68 = dVar56 * dVar12 * dVar7;
  dVar8 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [8];
  dVar17 = dVar138 * dVar32 * dVar8;
  dVar18 = dVar17 * dVar6 * dVar7;
  dVar98 = dVar27 * dVar12 * dVar7;
  dVar19 = dVar48 * dVar79 * dVar30;
  dVar101 = dVar143 * dVar19;
  dVar19 = dVar19 * dVar6;
  dVar76 = dVar48 * dVar79 * dVar88;
  dVar20 = dVar76 * dVar143;
  dVar21 = dVar20 * dVar135;
  dVar22 = dVar9 * dVar58 * dVar6;
  dVar23 = dVar58 * dVar12 * dVar7;
  dVar24 = dVar90 * dVar12 * dVar135;
  dVar144 = dVar141 * dVar79 * dVar30;
  dVar62 = dVar144 * dVar143;
  dVar63 = dVar62 * dVar135;
  dVar25 = dVar37 * dVar30;
  dVar26 = dVar25 * dVar143;
  dVar64 = dVar13 * dVar12 * dVar7;
  dVar66 = dVar56 * dVar12 * dVar135;
  dVar48 = dVar48 * dVar138 * dVar8;
  dVar74 = dVar48 * dVar143 * dVar135;
  dVar81 = dVar27 * dVar12 * dVar135;
  dVar27 = dVar14 * dVar12 * dVar135;
  dVar44 = dVar51 * dVar8 * dVar143;
  dVar142 = dVar93 * dVar8 * dVar143;
  dVar145 = dVar142 * dVar135;
  dVar52 = dVar32 * dVar79 * dVar30;
  dVar150 = dVar143 * dVar52;
  dVar53 = dVar32 * dVar79 * dVar88;
  dVar154 = dVar53 * dVar143;
  dVar82 = dVar153 * dVar12 * dVar7;
  dVar32 = dVar54 * dVar12 * dVar7;
  dVar33 = dVar55 * dVar8 * dVar143;
  dVar34 = dVar100 * dVar8 * dVar6;
  dVar83 = dVar7 * dVar34;
  dVar84 = dVar132 * dVar79 * dVar30;
  dVar85 = dVar84 * dVar6;
  dVar155 = dVar7 * dVar85;
  dVar156 = dVar11 * dVar138 * dVar30;
  dVar35 = dVar156 * dVar143;
  dVar94 = dVar11 * dVar138 * dVar88;
  dVar36 = dVar94 * dVar143;
  dVar37 = dVar37 * dVar88;
  dVar50 = dVar37 * dVar6;
  dVar86 = dVar7 * dVar50;
  dVar95 = dVar11 * dVar10 * dVar30;
  dVar45 = dVar143 * dVar95;
  dVar30 = dVar30 * dVar70;
  dVar96 = dVar143 * dVar30;
  dVar97 = dVar96 * dVar135;
  dVar95 = dVar95 * dVar6;
  dVar99 = dVar7 * dVar95;
  dVar108 = dVar1 * dVar1;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar51 = dVar51 * dVar8 * dVar6;
  dVar102 = dVar7 * dVar51;
  dVar52 = dVar52 * dVar6;
  dVar53 = dVar53 * dVar6;
  dVar103 = dVar7 * dVar53;
  dVar54 = dVar54 * dVar12 * dVar135;
  dVar55 = dVar55 * dVar8 * dVar6;
  dVar104 = dVar7 * dVar55;
  dVar156 = dVar156 * dVar6;
  dVar94 = dVar94 * dVar6;
  dVar105 = dVar7 * dVar94;
  dVar120 = dVar13 * dVar12 * dVar135;
  dVar109 = dVar17 * dVar143 * dVar135;
  dVar110 = dVar48 * dVar6 * dVar7;
  dVar111 = dVar14 * dVar12 * dVar7;
  dVar75 = dVar93 * dVar8 * dVar6;
  dVar112 = dVar7 * dVar75;
  dVar76 = dVar76 * dVar6;
  dVar113 = dVar7 * dVar76;
  dVar118 = dVar153 * dVar12 * dVar135;
  dVar100 = dVar100 * dVar8 * dVar143;
  dVar119 = dVar100 * dVar135;
  dVar125 = dVar90 * dVar12 * dVar7;
  dVar126 = dVar58 * dVar12 * dVar135;
  dVar84 = dVar84 * dVar143;
  dVar130 = dVar84 * dVar135;
  dVar144 = dVar144 * dVar6;
  dVar131 = dVar7 * dVar144;
  dVar25 = dVar25 * dVar6;
  dVar37 = dVar37 * dVar143;
  dVar136 = dVar37 * dVar135;
  dVar38 = dVar45 * dVar135;
  dVar30 = dVar30 * dVar6;
  dVar137 = dVar7 * dVar30;
  dVar140 = dVar29 * dVar29;
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x1a];
  dVar17 = dVar132 * dVar10 * dVar8;
  dVar8 = dVar10 * dVar141 * dVar8;
  dVar14 = dVar141 * dVar79 * dVar88;
  dVar114 = dVar132 * dVar79 * dVar88;
  dVar69 = dVar11 * dVar10 * dVar88;
  dVar70 = dVar70 * dVar88;
  dVar39 = dVar143 * dVar14;
  dVar40 = dVar143 * dVar114;
  dVar114 = dVar114 * dVar6;
  dVar14 = dVar14 * dVar6;
  dVar89 = dVar143 * dVar69;
  dVar46 = dVar143 * dVar70;
  dVar70 = dVar70 * dVar6;
  dVar69 = dVar69 * dVar6;
  dVar132 = dVar154 * dVar135;
  dVar11 = dVar33 * dVar135;
  dVar77 = dVar17 * dVar143 * dVar135;
  dVar79 = dVar8 * dVar143 * dVar135;
  dVar8 = dVar8 * dVar6 * dVar7;
  dVar141 = dVar17 * dVar6 * dVar7;
  dVar17 = dVar36 * dVar135;
  dVar93 = dVar44 * dVar135;
  dVar41 = dVar47 * dVar47;
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x19];
  dVar10 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x18];
  dVar121 = dVar2 * dVar2;
  dVar42 = dVar87 * dVar87;
  dVar153 = dVar138 * dVar138;
  local_28 = dVar70 * dVar135 * dVar4 * dVar153 * dVar10 +
             dVar69 * dVar135 * dVar4 * dVar87 * dVar138 * dVar48 +
             dVar7 * dVar69 * dVar5 * dVar153 * dVar10 +
             dVar70 * dVar7 * dVar5 * dVar87 * dVar138 * dVar48 +
             dVar89 * dVar135 * dVar4 * dVar153 * dVar88 +
             dVar46 * dVar135 * dVar4 * dVar2 * dVar138 * dVar48 +
             dVar7 * dVar46 * dVar5 * dVar153 * dVar88 +
             dVar7 * dVar89 * dVar5 * dVar2 * dVar138 * dVar48 +
             dVar30 * dVar135 * dVar4 * dVar47 * dVar138 * dVar10 +
             dVar95 * dVar135 * dVar4 * dVar47 * dVar87 * dVar48 +
             dVar99 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar137 * dVar5 * dVar29 * dVar138 * dVar48 +
             dVar4 * dVar137 * dVar47 * dVar2 * dVar48 +
             dVar4 * dVar99 * dVar1 * dVar138 * dVar48 +
             dVar97 * dVar5 * dVar47 * dVar87 * dVar48 +
             dVar38 * dVar5 * dVar29 * dVar138 * dVar48 +
             dVar4 * dVar38 * dVar47 * dVar138 * dVar88 +
             dVar4 * dVar97 * dVar1 * dVar138 * dVar48 +
             dVar7 * dVar96 * dVar5 * dVar47 * dVar138 * dVar88 +
             dVar7 * dVar45 * dVar5 * dVar47 * dVar2 * dVar48 +
             dVar50 * dVar135 * dVar4 * dVar47 * dVar138 * dVar10 +
             dVar94 * dVar135 * dVar4 * dVar29 * dVar138 * dVar48 +
             dVar105 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar86 * dVar5 * dVar47 * dVar87 * dVar48 +
             dVar4 * dVar105 * dVar47 * dVar2 * dVar48 +
             dVar4 * dVar86 * dVar1 * dVar138 * dVar48 +
             dVar5 * dVar17 * dVar47 * dVar87 * dVar48 +
             dVar5 * dVar136 * dVar29 * dVar138 * dVar48 +
             dVar17 * dVar4 * dVar47 * dVar138 * dVar88 +
             dVar136 * dVar4 * dVar47 * dVar2 * dVar48 +
             dVar37 * dVar7 * dVar5 * dVar47 * dVar138 * dVar88 +
             dVar36 * dVar7 * dVar5 * dVar1 * dVar138 * dVar48 +
             dVar25 * dVar135 * dVar4 * dVar41 * dVar10 +
             dVar156 * dVar135 * dVar4 * dVar29 * dVar47 * dVar48 +
             dVar156 * dVar7 * dVar5 * dVar41 * dVar10 +
             dVar25 * dVar7 * dVar5 * dVar29 * dVar47 * dVar48 +
             dVar35 * dVar135 * dVar4 * dVar41 * dVar88 +
             dVar26 * dVar135 * dVar4 * dVar1 * dVar47 * dVar48 +
             dVar26 * dVar7 * dVar5 * dVar41 * dVar88 +
             dVar35 * dVar7 * dVar5 * dVar1 * dVar47 * dVar48 +
             dVar114 * dVar135 * dVar4 * dVar153 * dVar10 +
             dVar14 * dVar135 * dVar4 * dVar87 * dVar138 * dVar48 +
             dVar14 * dVar7 * dVar4 * dVar153 * dVar88 +
             dVar114 * dVar7 * dVar4 * dVar2 * dVar138 * dVar48 +
             dVar39 * dVar135 * dVar5 * dVar153 * dVar10 +
             dVar40 * dVar135 * dVar5 * dVar87 * dVar138 * dVar48 +
             dVar7 * dVar40 * dVar5 * dVar153 * dVar88 +
             dVar7 * dVar39 * dVar5 * dVar2 * dVar138 * dVar48 +
             dVar85 * dVar135 * dVar4 * dVar47 * dVar138 * dVar10 +
             dVar144 * dVar135 * dVar4 * dVar47 * dVar87 * dVar48 +
             dVar155 * dVar5 * dVar47 * dVar87 * dVar48 +
             dVar131 * dVar5 * dVar29 * dVar138 * dVar48 +
             dVar4 * dVar131 * dVar47 * dVar138 * dVar88 +
             dVar4 * dVar155 * dVar1 * dVar138 * dVar48 +
             dVar63 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar5 * dVar130 * dVar29 * dVar138 * dVar48 +
             dVar130 * dVar4 * dVar47 * dVar2 * dVar48 +
             dVar63 * dVar4 * dVar1 * dVar138 * dVar48 +
             dVar84 * dVar7 * dVar5 * dVar47 * dVar138 * dVar88 +
             dVar62 * dVar7 * dVar5 * dVar47 * dVar2 * dVar48 +
             dVar8 * dVar5 * dVar153 * dVar10 +
             dVar141 * dVar5 * dVar87 * dVar138 * dVar48 +
             dVar141 * dVar4 * dVar153 * dVar88 +
             dVar8 * dVar4 * dVar2 * dVar138 * dVar48 +
             dVar77 * dVar5 * dVar153 * dVar10 +
             dVar79 * dVar5 * dVar87 * dVar138 * dVar48 +
             dVar79 * dVar4 * dVar153 * dVar88 +
             dVar77 * dVar4 * dVar2 * dVar138 * dVar48 +
             dVar24 * dVar5 * dVar47 * dVar42 +
             dVar5 * dVar126 * dVar29 * dVar87 * dVar138 +
             dVar126 * dVar4 * dVar47 * dVar87 * dVar2 +
             dVar24 * dVar4 * dVar1 * dVar87 * dVar138 +
             dVar23 * dVar5 * dVar47 * dVar87 * dVar2 +
             dVar125 * dVar5 * dVar29 * dVar2 * dVar138 +
             dVar125 * dVar4 * dVar47 * dVar121 +
             dVar23 * dVar4 * dVar1 * dVar2 * dVar138 +
             dVar22 * dVar5 * dVar47 * dVar42 +
             dVar5 * dVar80 * dVar29 * dVar87 * dVar138 +
             dVar80 * dVar4 * dVar47 * dVar87 * dVar2 +
             dVar22 * dVar4 * dVar1 * dVar87 * dVar138 +
             dVar58 * dVar6 * dVar7 * dVar28 * dVar1 * dVar87 * dVar138 +
             dVar90 * dVar6 * dVar7 * dVar28 * dVar29 * dVar2 * dVar138 +
             dVar43 * dVar5 * dVar47 * dVar87 * dVar2 +
             dVar16 * dVar5 * dVar29 * dVar2 * dVar138 +
             dVar4 * dVar16 * dVar47 * dVar121 +
             dVar4 * dVar43 * dVar1 * dVar2 * dVar138 +
             dVar135 * dVar143 * dVar90 * dVar28 * dVar1 * dVar87 * dVar138 +
             dVar135 * dVar143 * dVar58 * dVar28 * dVar29 * dVar2 * dVar138 +
             dVar34 * dVar135 * dVar4 * dVar47 * dVar87 * dVar48 +
             dVar55 * dVar135 * dVar4 * dVar29 * dVar138 * dVar48 +
             dVar83 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar104 * dVar5 * dVar47 * dVar87 * dVar48 +
             dVar4 * dVar104 * dVar47 * dVar138 * dVar88 +
             dVar4 * dVar83 * dVar1 * dVar138 * dVar48 +
             dVar11 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar5 * dVar119 * dVar29 * dVar138 * dVar48 +
             dVar119 * dVar4 * dVar47 * dVar138 * dVar88 +
             dVar11 * dVar4 * dVar47 * dVar2 * dVar48 +
             dVar100 * dVar7 * dVar5 * dVar47 * dVar2 * dVar48 +
             dVar33 * dVar7 * dVar5 * dVar1 * dVar138 * dVar48 +
             dVar54 * dVar5 * dVar47 * dVar42 +
             dVar5 * dVar118 * dVar29 * dVar87 * dVar138 +
             dVar118 * dVar4 * dVar47 * dVar87 * dVar2 +
             dVar54 * dVar4 * dVar29 * dVar2 * dVar138 +
             dVar82 * dVar5 * dVar47 * dVar87 * dVar2 +
             dVar32 * dVar5 * dVar1 * dVar87 * dVar138 +
             dVar4 * dVar32 * dVar47 * dVar121 +
             dVar4 * dVar82 * dVar1 * dVar2 * dVar138 +
             dVar15 * dVar9 * dVar4 * dVar1 * dVar87 * dVar138 +
             dVar73 * dVar9 * dVar4 * dVar29 * dVar2 * dVar138 +
             dVar135 * dVar15 * dVar28 * dVar47 * dVar42 +
             dVar135 * dVar73 * dVar28 * dVar29 * dVar87 * dVar138 +
             dVar73 * dVar7 * dVar28 * dVar47 * dVar87 * dVar2 +
             dVar15 * dVar7 * dVar28 * dVar1 * dVar87 * dVar138 +
             dVar152 * dVar9 * dVar5 * dVar1 * dVar87 * dVar138 +
             dVar72 * dVar9 * dVar5 * dVar29 * dVar2 * dVar138 +
             dVar152 * dVar135 * dVar28 * dVar47 * dVar87 * dVar2 +
             dVar72 * dVar135 * dVar28 * dVar29 * dVar2 * dVar138 +
             dVar7 * dVar72 * dVar28 * dVar47 * dVar121 +
             dVar7 * dVar152 * dVar28 * dVar1 * dVar2 * dVar138 +
             dVar107 * dVar12 * dVar135 * dVar4 * dVar1 * dVar47 * dVar87 +
             dVar129 * dVar12 * dVar135 * dVar4 * dVar29 * dVar47 * dVar2 +
             dVar129 * dVar12 * dVar7 * dVar5 * dVar1 * dVar47 * dVar87 +
             dVar107 * dVar12 * dVar7 * dVar5 * dVar29 * dVar47 * dVar2 +
             dVar134 * dVar9 * dVar5 * dVar29 * dVar47 * dVar87 +
             dVar65 * dVar9 * dVar5 * dVar140 * dVar138 +
             dVar65 * dVar9 * dVar4 * dVar1 * dVar47 * dVar87 +
             dVar134 * dVar9 * dVar4 * dVar29 * dVar1 * dVar138 +
             dVar65 * dVar135 * dVar28 * dVar29 * dVar47 * dVar87 +
             dVar134 * dVar135 * dVar28 * dVar140 * dVar138 +
             dVar134 * dVar7 * dVar28 * dVar1 * dVar47 * dVar87 +
             dVar65 * dVar7 * dVar28 * dVar29 * dVar1 * dVar138 +
             dVar128 * dVar9 * dVar5 * dVar29 * dVar47 * dVar2 +
             dVar106 * dVar9 * dVar5 * dVar29 * dVar1 * dVar138 +
             dVar106 * dVar9 * dVar4 * dVar1 * dVar47 * dVar2 +
             dVar128 * dVar9 * dVar4 * dVar108 * dVar138 +
             dVar106 * dVar135 * dVar28 * dVar29 * dVar47 * dVar2 +
             dVar128 * dVar135 * dVar28 * dVar29 * dVar1 * dVar138 +
             dVar128 * dVar7 * dVar28 * dVar1 * dVar47 * dVar2 +
             dVar7 * dVar106 * dVar28 * dVar108 * dVar138 +
             dVar76 * dVar135 * dVar4 * dVar47 * dVar138 * dVar10 +
             dVar53 * dVar135 * dVar4 * dVar29 * dVar138 * dVar48 +
             dVar103 * dVar5 * dVar47 * dVar87 * dVar48 +
             dVar113 * dVar5 * dVar29 * dVar138 * dVar48 +
             dVar4 * dVar103 * dVar47 * dVar138 * dVar88 +
             dVar4 * dVar113 * dVar47 * dVar2 * dVar48 +
             dVar5 * dVar132 * dVar47 * dVar138 * dVar10 +
             dVar5 * dVar21 * dVar47 * dVar87 * dVar48 +
             dVar132 * dVar4 * dVar47 * dVar2 * dVar48 +
             dVar21 * dVar4 * dVar1 * dVar138 * dVar48 +
             dVar20 * dVar7 * dVar5 * dVar47 * dVar138 * dVar88 +
             dVar154 * dVar7 * dVar5 * dVar1 * dVar138 * dVar48 +
             dVar19 * dVar135 * dVar4 * dVar41 * dVar10 +
             dVar52 * dVar135 * dVar4 * dVar29 * dVar47 * dVar48 +
             dVar52 * dVar7 * dVar4 * dVar41 * dVar88 +
             dVar19 * dVar7 * dVar4 * dVar1 * dVar47 * dVar48 +
             dVar150 * dVar135 * dVar5 * dVar41 * dVar10 +
             dVar101 * dVar135 * dVar5 * dVar29 * dVar47 * dVar48 +
             dVar7 * dVar101 * dVar5 * dVar41 * dVar88 +
             dVar7 * dVar150 * dVar5 * dVar1 * dVar47 * dVar48 +
             dVar75 * dVar135 * dVar4 * dVar47 * dVar87 * dVar48 +
             dVar51 * dVar135 * dVar4 * dVar29 * dVar138 * dVar48 +
             dVar102 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar112 * dVar5 * dVar29 * dVar138 * dVar48 +
             dVar4 * dVar112 * dVar47 * dVar138 * dVar88 +
             dVar4 * dVar102 * dVar47 * dVar2 * dVar48 +
             dVar145 * dVar5 * dVar47 * dVar138 * dVar10 +
             dVar93 * dVar5 * dVar47 * dVar87 * dVar48 +
             dVar4 * dVar93 * dVar47 * dVar138 * dVar88 +
             dVar4 * dVar145 * dVar1 * dVar138 * dVar48 +
             dVar7 * dVar142 * dVar5 * dVar47 * dVar2 * dVar48 +
             dVar7 * dVar44 * dVar5 * dVar1 * dVar138 * dVar48 +
             dVar31 * dVar12 * dVar135 * dVar4 * dVar1 * dVar87 * dVar138 +
             dVar57 * dVar12 * dVar135 * dVar4 * dVar29 * dVar2 * dVar138 +
             dVar57 * dVar12 * dVar7 * dVar5 * dVar1 * dVar87 * dVar138 +
             dVar31 * dVar12 * dVar7 * dVar5 * dVar29 * dVar2 * dVar138 +
             dVar61 * dVar9 * dVar5 * dVar47 * dVar42 +
             dVar117 * dVar9 * dVar5 * dVar29 * dVar87 * dVar138 +
             dVar117 * dVar9 * dVar4 * dVar47 * dVar87 * dVar2 +
             dVar61 * dVar9 * dVar4 * dVar29 * dVar2 * dVar138 +
             dVar117 * dVar135 * dVar28 * dVar47 * dVar42 +
             dVar61 * dVar135 * dVar28 * dVar29 * dVar87 * dVar138 +
             dVar61 * dVar7 * dVar28 * dVar47 * dVar87 * dVar2 +
             dVar117 * dVar7 * dVar28 * dVar29 * dVar2 * dVar138 +
             dVar116 * dVar9 * dVar5 * dVar47 * dVar87 * dVar2 +
             dVar92 * dVar9 * dVar5 * dVar1 * dVar87 * dVar138 +
             dVar92 * dVar9 * dVar4 * dVar47 * dVar121 +
             dVar116 * dVar9 * dVar4 * dVar1 * dVar2 * dVar138 +
             dVar92 * dVar135 * dVar28 * dVar47 * dVar87 * dVar2 +
             dVar116 * dVar135 * dVar28 * dVar1 * dVar87 * dVar138 +
             dVar116 * dVar7 * dVar28 * dVar47 * dVar121 +
             dVar92 * dVar7 * dVar28 * dVar1 * dVar2 * dVar138 +
             dVar81 * dVar5 * dVar29 * dVar47 * dVar87 +
             dVar27 * dVar5 * dVar140 * dVar138 +
             dVar4 * dVar27 * dVar1 * dVar47 * dVar87 +
             dVar4 * dVar81 * dVar29 * dVar1 * dVar138 +
             dVar111 * dVar5 * dVar29 * dVar47 * dVar2 +
             dVar98 * dVar5 * dVar29 * dVar1 * dVar138 +
             dVar98 * dVar4 * dVar1 * dVar47 * dVar2 +
             dVar4 * dVar111 * dVar108 * dVar138 +
             dVar78 * dVar9 * dVar4 * dVar1 * dVar47 * dVar87 +
             dVar60 * dVar9 * dVar4 * dVar29 * dVar47 * dVar2 +
             dVar78 * dVar135 * dVar28 * dVar29 * dVar47 * dVar87 +
             dVar135 * dVar60 * dVar28 * dVar140 * dVar138 +
             dVar7 * dVar60 * dVar28 * dVar29 * dVar47 * dVar2 +
             dVar7 * dVar78 * dVar28 * dVar29 * dVar1 * dVar138 +
             dVar71 * dVar9 * dVar5 * dVar1 * dVar47 * dVar87 +
             dVar115 * dVar9 * dVar5 * dVar29 * dVar47 * dVar2 +
             dVar71 * dVar135 * dVar28 * dVar1 * dVar47 * dVar87 +
             dVar115 * dVar135 * dVar28 * dVar29 * dVar1 * dVar138 +
             dVar115 * dVar7 * dVar28 * dVar1 * dVar47 * dVar2 +
             dVar71 * dVar7 * dVar28 * dVar108 * dVar138 +
             dVar18 * dVar5 * dVar41 * dVar10 +
             dVar110 * dVar5 * dVar29 * dVar47 * dVar48 +
             dVar110 * dVar4 * dVar41 * dVar88 +
             dVar18 * dVar4 * dVar1 * dVar47 * dVar48 +
             dVar74 * dVar5 * dVar41 * dVar10 +
             dVar109 * dVar5 * dVar29 * dVar47 * dVar48 +
             dVar4 * dVar109 * dVar41 * dVar88 +
             dVar4 * dVar74 * dVar1 * dVar47 * dVar48 +
             dVar66 * dVar5 * dVar29 * dVar47 * dVar87 +
             dVar120 * dVar5 * dVar140 * dVar138 +
             dVar4 * dVar120 * dVar29 * dVar47 * dVar2 +
             dVar4 * dVar66 * dVar29 * dVar1 * dVar138 +
             dVar64 * dVar5 * dVar1 * dVar47 * dVar87 +
             dVar68 * dVar5 * dVar29 * dVar1 * dVar138 +
             dVar68 * dVar4 * dVar1 * dVar47 * dVar2 +
             dVar64 * dVar4 * dVar108 * dVar138 +
             dVar67 * dVar5 * dVar29 * dVar47 * dVar87 +
             dVar49 * dVar5 * dVar140 * dVar138 +
             dVar4 * dVar49 * dVar29 * dVar47 * dVar2 +
             dVar4 * dVar67 * dVar29 * dVar1 * dVar138 +
             dVar13 * dVar6 * dVar7 * dVar28 * dVar1 * dVar47 * dVar87 +
             dVar56 * dVar6 * dVar7 * dVar28 * dVar29 * dVar47 * dVar2 +
             dVar91 * dVar5 * dVar1 * dVar47 * dVar87 +
             dVar59 * dVar5 * dVar29 * dVar1 * dVar138 +
             dVar59 * dVar4 * dVar1 * dVar47 * dVar2 +
             dVar91 * dVar4 * dVar108 * dVar138 +
             dVar13 * dVar143 * dVar135 * dVar28 * dVar29 * dVar47 * dVar2 +
             dVar56 * dVar143 * dVar135 * dVar28 * dVar1 * dVar47 * dVar87;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar3,&local_28);
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[3];
  dVar88 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[7];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[9];
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0];
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[1];
  dVar12 = dVar135 * dVar138 * dVar88;
  dVar10 = dVar138 * -dVar135 * dVar88;
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[4];
  dVar30 = -dVar135 * dVar29;
  dVar132 = dVar30 * dVar88;
  dVar152 = dVar135 * dVar29 * dVar88;
  dVar13 = dVar138 * -dVar28;
  dVar92 = dVar28 * dVar138 * dVar88;
  dVar88 = dVar13 * dVar88;
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[6];
  dVar30 = dVar30 * dVar48;
  dVar16 = dVar135 * dVar29 * dVar48;
  dVar80 = dVar28 * dVar138 * dVar48;
  dVar13 = dVar13 * dVar48;
  dVar8 = -dVar28 * dVar29 * dVar48;
  dVar48 = dVar28 * dVar29 * dVar48;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[10];
  dVar4 = dVar30 * dVar143;
  dVar5 = dVar16 * dVar143;
  dVar16 = dVar16 * dVar138;
  dVar30 = dVar30 * dVar138;
  dVar31 = dVar132 * dVar143;
  dVar49 = dVar152 * dVar143;
  dVar152 = dVar152 * dVar138;
  dVar132 = dVar132 * dVar138;
  dVar78 = dVar80 * dVar143;
  dVar11 = dVar13 * dVar143;
  dVar13 = dVar13 * dVar138;
  dVar80 = dVar80 * dVar138;
  dVar79 = dVar92 * dVar143;
  dVar9 = dVar88 * dVar143;
  dVar88 = dVar88 * dVar138;
  dVar92 = dVar92 * dVar138;
  dVar135 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0xd];
  dVar15 = dVar12 * dVar143 * dVar135;
  dVar28 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0xf];
  dVar29 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x13];
  dVar47 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x14];
  dVar117 = dVar10 * dVar143 * dVar135;
  dVar1 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0x10];
  dVar87 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x12];
  dVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.array
          [0xc];
  dVar128 = dVar10 * dVar138 * dVar2;
  dVar134 = dVar12 * dVar138 * dVar2;
  dVar6 = dVar8 * dVar143 * dVar135;
  dVar12 = dVar143 * dVar48 * dVar135;
  dVar7 = dVar48 * dVar138 * dVar2;
  dVar10 = dVar8 * dVar138 * dVar2;
  dVar14 = dVar47 * dVar47;
  dVar138 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x16];
  dVar143 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
            array[0x17];
  dVar48 = (x->super_PlainObjectBase<Eigen::Matrix<double,_27,_1,_0,_27,_1>_>).m_storage.m_data.
           array[0x15];
  dVar8 = dVar143 * dVar143;
  local_30 = dVar7 * dVar1 * dVar47 * dVar48 * dVar143 +
             dVar10 * dVar1 * dVar87 * dVar8 +
             dVar28 * dVar10 * dVar47 * dVar138 * dVar143 +
             dVar7 * dVar28 * dVar29 * dVar8 +
             dVar6 * dVar1 * dVar47 * dVar48 * dVar143 +
             dVar12 * dVar1 * dVar87 * dVar8 +
             dVar12 * dVar28 * dVar47 * dVar138 * dVar143 +
             dVar28 * dVar6 * dVar29 * dVar8 +
             dVar88 * dVar135 * dVar28 * dVar47 * dVar48 * dVar143 +
             dVar92 * dVar135 * dVar28 * dVar87 * dVar8 +
             dVar92 * dVar2 * dVar28 * dVar47 * dVar138 * dVar143 +
             dVar88 * dVar2 * dVar28 * dVar29 * dVar8 +
             dVar79 * dVar135 * dVar1 * dVar47 * dVar48 * dVar143 +
             dVar9 * dVar135 * dVar1 * dVar87 * dVar8 +
             dVar9 * dVar2 * dVar1 * dVar47 * dVar138 * dVar143 +
             dVar79 * dVar2 * dVar1 * dVar29 * dVar8 +
             dVar13 * dVar135 * dVar28 * dVar14 * dVar48 +
             dVar80 * dVar135 * dVar28 * dVar87 * dVar47 * dVar143 +
             dVar80 * dVar2 * dVar1 * dVar14 * dVar48 +
             dVar13 * dVar2 * dVar1 * dVar87 * dVar47 * dVar143 +
             dVar78 * dVar135 * dVar28 * dVar14 * dVar138 +
             dVar11 * dVar135 * dVar28 * dVar29 * dVar47 * dVar143 +
             dVar11 * dVar2 * dVar1 * dVar14 * dVar138 +
             dVar78 * dVar2 * dVar1 * dVar29 * dVar47 * dVar143 +
             dVar152 * dVar135 * dVar28 * dVar47 * dVar48 * dVar143 +
             dVar132 * dVar135 * dVar28 * dVar87 * dVar8 +
             dVar132 * dVar2 * dVar1 * dVar47 * dVar48 * dVar143 +
             dVar152 * dVar2 * dVar1 * dVar87 * dVar8 +
             dVar31 * dVar135 * dVar28 * dVar47 * dVar138 * dVar143 +
             dVar49 * dVar135 * dVar28 * dVar29 * dVar8 +
             dVar49 * dVar2 * dVar1 * dVar47 * dVar138 * dVar143 +
             dVar31 * dVar2 * dVar1 * dVar29 * dVar8 +
             dVar16 * dVar135 * dVar28 * dVar14 * dVar48 +
             dVar30 * dVar135 * dVar28 * dVar87 * dVar47 * dVar143 +
             dVar30 * dVar2 * dVar28 * dVar14 * dVar138 +
             dVar16 * dVar2 * dVar28 * dVar29 * dVar47 * dVar143 +
             dVar4 * dVar135 * dVar1 * dVar14 * dVar48 +
             dVar5 * dVar135 * dVar1 * dVar87 * dVar47 * dVar143 +
             dVar5 * dVar2 * dVar1 * dVar14 * dVar138 +
             dVar4 * dVar2 * dVar1 * dVar29 * dVar47 * dVar143 +
             dVar128 * dVar1 * dVar14 * dVar48 +
             dVar134 * dVar1 * dVar87 * dVar47 * dVar143 +
             dVar134 * dVar28 * dVar14 * dVar138 +
             dVar128 * dVar28 * dVar29 * dVar47 * dVar143 +
             dVar15 * dVar1 * dVar14 * dVar48 +
             dVar117 * dVar1 * dVar87 * dVar47 * dVar143 +
             dVar15 * dVar28 * dVar29 * dVar47 * dVar143 + dVar117 * dVar28 * dVar14 * dVar138;
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_(pCVar3,&local_30);
  if ((local_f8.m_currentBlockRows + local_f8.m_row == 5) && (local_f8.m_col == 1)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 1>>::finished() [MatrixType = Eigen::Matrix<double, 5, 1>]"
               );
}

Assistant:

inline Eigen::Matrix<double, 5, 1> calculate_coefficients(const Eigen::Matrix<double, 27, 1> &x) {
    Eigen::Matrix<double, 5, 1> coeffs;
    coeffs << x[0]*x[5]*x[8]*x[11]*x[12]*x[17]*x[18]*std::pow(x[25], 2) - x[0]*x[5]*x[8]*x[11]*x[12]*x[17]*x[19]*x[24]*x[25] - x[0]*x[5]*x[8]*x[11]*x[13]*x[17]*x[18]*x[24]*x[25] + x[0]*x[5]*x[8]*x[11]*x[13]*x[17]*x[19]*std::pow(x[24], 2) - x[0]*x[5]*x[8]*x[11]*x[14]*x[15]*x[18]*std::pow(x[25], 2) + x[0]*x[5]*x[8]*x[11]*x[14]*x[15]*x[19]*x[24]*x[25] + x[0]*x[5]*x[8]*x[11]*x[14]*x[16]*x[18]*x[24]*x[25] - x[0]*x[5]*x[8]*x[11]*x[14]*x[16]*x[19]*std::pow(x[24], 2) + x[1]*x[5]*x[8]*x[11]*x[12]*x[17]*x[21]*std::pow(x[25], 2) - x[1]*x[5]*x[8]*x[11]*x[12]*x[17]*x[22]*x[24]*x[25] - x[1]*x[5]*x[8]*x[11]*x[13]*x[17]*x[21]*x[24]*x[25] + x[1]*x[5]*x[8]*x[11]*x[13]*x[17]*x[22]*std::pow(x[24], 2) - x[1]*x[5]*x[8]*x[11]*x[14]*x[15]*x[21]*std::pow(x[25], 2) + x[1]*x[5]*x[8]*x[11]*x[14]*x[15]*x[22]*x[24]*x[25] + x[1]*x[5]*x[8]*x[11]*x[14]*x[16]*x[21]*x[24]*x[25] - x[1]*x[5]*x[8]*x[11]*x[14]*x[16]*x[22]*std::pow(x[24], 2) - x[2]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*std::pow(x[25], 2) + x[2]*x[3]*x[8]*x[9]*x[14]*x[17]*x[19]*x[24]*x[25] + x[2]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[24]*x[25] - x[2]*x[3]*x[8]*x[10]*x[14]*x[17]*x[19]*std::pow(x[24], 2) + x[2]*x[3]*x[8]*x[11]*x[14]*x[15]*x[18]*std::pow(x[25], 2) - x[2]*x[3]*x[8]*x[11]*x[14]*x[15]*x[19]*x[24]*x[25] - x[2]*x[3]*x[8]*x[11]*x[14]*x[16]*x[18]*x[24]*x[25] + x[2]*x[3]*x[8]*x[11]*x[14]*x[16]*x[19]*std::pow(x[24], 2) - x[2]*x[4]*x[8]*x[9]*x[14]*x[17]*x[21]*std::pow(x[25], 2) + x[2]*x[4]*x[8]*x[9]*x[14]*x[17]*x[22]*x[24]*x[25] + x[2]*x[4]*x[8]*x[10]*x[14]*x[17]*x[21]*x[24]*x[25] - x[2]*x[4]*x[8]*x[10]*x[14]*x[17]*x[22]*std::pow(x[24], 2) + x[2]*x[4]*x[8]*x[11]*x[14]*x[15]*x[21]*std::pow(x[25], 2) - x[2]*x[4]*x[8]*x[11]*x[14]*x[15]*x[22]*x[24]*x[25] - x[2]*x[4]*x[8]*x[11]*x[14]*x[16]*x[21]*x[24]*x[25] + x[2]*x[4]*x[8]*x[11]*x[14]*x[16]*x[22]*std::pow(x[24], 2) + x[2]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*std::pow(x[25], 2) - x[2]*x[5]*x[6]*x[9]*x[14]*x[17]*x[19]*x[24]*x[25] - x[2]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[14]*x[17]*x[19]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[11]*x[12]*x[17]*x[18]*std::pow(x[25], 2) + x[2]*x[5]*x[6]*x[11]*x[12]*x[17]*x[19]*x[24]*x[25] + x[2]*x[5]*x[6]*x[11]*x[13]*x[17]*x[18]*x[24]*x[25] - x[2]*x[5]*x[6]*x[11]*x[13]*x[17]*x[19]*std::pow(x[24], 2) + x[2]*x[5]*x[7]*x[9]*x[14]*x[17]*x[21]*std::pow(x[25], 2) - x[2]*x[5]*x[7]*x[9]*x[14]*x[17]*x[22]*x[24]*x[25] - x[2]*x[5]*x[7]*x[10]*x[14]*x[17]*x[21]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[14]*x[17]*x[22]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[11]*x[12]*x[17]*x[21]*std::pow(x[25], 2) + x[2]*x[5]*x[7]*x[11]*x[12]*x[17]*x[22]*x[24]*x[25] + x[2]*x[5]*x[7]*x[11]*x[13]*x[17]*x[21]*x[24]*x[25] - x[2]*x[5]*x[7]*x[11]*x[13]*x[17]*x[22]*std::pow(x[24], 2),  // NOLINT [whitespace/line_length]
     -x[0]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*x[19]*x[25] + x[0]*x[3]*x[8]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[24] + x[0]*x[3]*x[8]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[25] - x[0]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[19]*x[24] + x[0]*x[3]*x[8]*x[11]*x[12]*x[17]*x[18]*x[19]*x[25] - x[0]*x[3]*x[8]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[24] - x[0]*x[3]*x[8]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[25] + x[0]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[19]*x[24] - x[0]*x[4]*x[8]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] + x[0]*x[4]*x[8]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] + x[0]*x[4]*x[8]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] - x[0]*x[4]*x[8]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[0]*x[4]*x[8]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] - x[0]*x[4]*x[8]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] - x[0]*x[4]*x[8]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] + x[0]*x[4]*x[8]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[0]*x[4]*x[8]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] + x[0]*x[4]*x[8]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] + x[0]*x[4]*x[8]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] - x[0]*x[4]*x[8]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] + x[0]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*x[19]*x[25] - x[0]*x[5]*x[6]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[24] - x[0]*x[5]*x[6]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[25] + x[0]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[19]*x[24] - x[0]*x[5]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[25] + x[0]*x[5]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[24] + x[0]*x[5]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[25] - x[0]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[24] + x[0]*x[5]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] - x[0]*x[5]*x[7]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] - x[0]*x[5]*x[7]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] + x[0]*x[5]*x[7]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] - x[0]*x[5]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] - x[0]*x[5]*x[7]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[0]*x[5]*x[7]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] + x[0]*x[5]*x[7]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] + x[0]*x[5]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] - x[0]*x[5]*x[7]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] + x[0]*x[5]*x[8]*x[9]*x[12]*x[17]*x[19]*x[25]*x[26] - x[0]*x[5]*x[8]*x[9]*x[12]*x[17]*x[20]*std::pow(x[25], 2) - x[0]*x[5]*x[8]*x[9]*x[13]*x[17]*x[19]*x[24]*x[26] + x[0]*x[5]*x[8]*x[9]*x[13]*x[17]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[9]*x[14]*x[15]*x[19]*x[25]*x[26] + x[0]*x[5]*x[8]*x[9]*x[14]*x[15]*x[20]*std::pow(x[25], 2) + x[0]*x[5]*x[8]*x[9]*x[14]*x[16]*x[19]*x[24]*x[26] - x[0]*x[5]*x[8]*x[9]*x[14]*x[16]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[10]*x[12]*x[17]*x[18]*x[25]*x[26] + x[0]*x[5]*x[8]*x[10]*x[12]*x[17]*x[20]*x[24]*x[25] + x[0]*x[5]*x[8]*x[10]*x[13]*x[17]*x[18]*x[24]*x[26] - x[0]*x[5]*x[8]*x[10]*x[13]*x[17]*x[20]*std::pow(x[24], 2) + x[0]*x[5]*x[8]*x[10]*x[14]*x[15]*x[18]*x[25]*x[26] - x[0]*x[5]*x[8]*x[10]*x[14]*x[15]*x[20]*x[24]*x[25] - x[0]*x[5]*x[8]*x[10]*x[14]*x[16]*x[18]*x[24]*x[26] + x[0]*x[5]*x[8]*x[10]*x[14]*x[16]*x[20]*std::pow(x[24], 2) - x[0]*x[5]*x[8]*x[11]*x[12]*x[16]*x[18]*x[25]*x[26] + x[0]*x[5]*x[8]*x[11]*x[12]*x[16]*x[19]*x[24]*x[26] + x[0]*x[5]*x[8]*x[11]*x[13]*x[15]*x[18]*x[25]*x[26] - x[0]*x[5]*x[8]*x[11]*x[13]*x[15]*x[19]*x[24]*x[26] - x[1]*x[3]*x[8]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] + x[1]*x[3]*x[8]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] + x[1]*x[3]*x[8]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] - x[1]*x[3]*x[8]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] + x[1]*x[3]*x[8]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] - x[1]*x[3]*x[8]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] - x[1]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] + x[1]*x[3]*x[8]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[1]*x[3]*x[8]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] - x[1]*x[3]*x[8]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] - x[1]*x[3]*x[8]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] + x[1]*x[3]*x[8]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] - x[1]*x[4]*x[8]*x[9]*x[14]*x[17]*x[21]*x[22]*x[25] + x[1]*x[4]*x[8]*x[9]*x[14]*x[17]*std::pow(x[22], 2)*x[24] + x[1]*x[4]*x[8]*x[10]*x[14]*x[17]*std::pow(x[21], 2)*x[25] - x[1]*x[4]*x[8]*x[10]*x[14]*x[17]*x[21]*x[22]*x[24] + x[1]*x[4]*x[8]*x[11]*x[12]*x[17]*x[21]*x[22]*x[25] - x[1]*x[4]*x[8]*x[11]*x[12]*x[17]*std::pow(x[22], 2)*x[24] - x[1]*x[4]*x[8]*x[11]*x[13]*x[17]*std::pow(x[21], 2)*x[25] + x[1]*x[4]*x[8]*x[11]*x[13]*x[17]*x[21]*x[22]*x[24] + x[1]*x[5]*x[6]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[17]*x[19]*x[22]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[17]*x[18]*x[21]*x[25] + x[1]*x[5]*x[6]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] + x[1]*x[5]*x[6]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] - x[1]*x[5]*x[6]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] + x[1]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] - x[1]*x[5]*x[6]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] + x[1]*x[5]*x[7]*x[9]*x[14]*x[17]*x[21]*x[22]*x[25] - x[1]*x[5]*x[7]*x[9]*x[14]*x[17]*std::pow(x[22], 2)*x[24] - x[1]*x[5]*x[7]*x[10]*x[14]*x[17]*std::pow(x[21], 2)*x[25] + x[1]*x[5]*x[7]*x[10]*x[14]*x[17]*x[21]*x[22]*x[24] - x[1]*x[5]*x[7]*x[11]*x[14]*x[15]*x[21]*x[22]*x[25] + x[1]*x[5]*x[7]*x[11]*x[14]*x[15]*std::pow(x[22], 2)*x[24] + x[1]*x[5]*x[7]*x[11]*x[14]*x[16]*std::pow(x[21], 2)*x[25] - x[1]*x[5]*x[7]*x[11]*x[14]*x[16]*x[21]*x[22]*x[24] + x[1]*x[5]*x[8]*x[9]*x[12]*x[17]*x[22]*x[25]*x[26] - x[1]*x[5]*x[8]*x[9]*x[12]*x[17]*x[23]*std::pow(x[25], 2) - x[1]*x[5]*x[8]*x[9]*x[13]*x[17]*x[22]*x[24]*x[26] + x[1]*x[5]*x[8]*x[9]*x[13]*x[17]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[9]*x[14]*x[15]*x[22]*x[25]*x[26] + x[1]*x[5]*x[8]*x[9]*x[14]*x[15]*x[23]*std::pow(x[25], 2) + x[1]*x[5]*x[8]*x[9]*x[14]*x[16]*x[22]*x[24]*x[26] - x[1]*x[5]*x[8]*x[9]*x[14]*x[16]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[10]*x[12]*x[17]*x[21]*x[25]*x[26] + x[1]*x[5]*x[8]*x[10]*x[12]*x[17]*x[23]*x[24]*x[25] + x[1]*x[5]*x[8]*x[10]*x[13]*x[17]*x[21]*x[24]*x[26] - x[1]*x[5]*x[8]*x[10]*x[13]*x[17]*x[23]*std::pow(x[24], 2) + x[1]*x[5]*x[8]*x[10]*x[14]*x[15]*x[21]*x[25]*x[26] - x[1]*x[5]*x[8]*x[10]*x[14]*x[15]*x[23]*x[24]*x[25] - x[1]*x[5]*x[8]*x[10]*x[14]*x[16]*x[21]*x[24]*x[26] + x[1]*x[5]*x[8]*x[10]*x[14]*x[16]*x[23]*std::pow(x[24], 2) - x[1]*x[5]*x[8]*x[11]*x[12]*x[16]*x[21]*x[25]*x[26] + x[1]*x[5]*x[8]*x[11]*x[12]*x[16]*x[22]*x[24]*x[26] + x[1]*x[5]*x[8]*x[11]*x[13]*x[15]*x[21]*x[25]*x[26] - x[1]*x[5]*x[8]*x[11]*x[13]*x[15]*x[22]*x[24]*x[26] - x[2]*x[3]*x[6]*x[11]*x[12]*x[17]*x[18]*x[19]*x[25] + x[2]*x[3]*x[6]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[24] + x[2]*x[3]*x[6]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[25] - x[2]*x[3]*x[6]*x[11]*x[13]*x[17]*x[18]*x[19]*x[24] + x[2]*x[3]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[25] - x[2]*x[3]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[24] - x[2]*x[3]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[25] + x[2]*x[3]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[24] - x[2]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] + x[2]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] - x[2]*x[3]*x[7]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[2]*x[3]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[25] + x[2]*x[3]*x[7]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] - x[2]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[14]*x[15]*x[18]*x[22]*x[25] - x[2]*x[3]*x[7]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] - x[2]*x[3]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] + x[2]*x[3]*x[7]*x[11]*x[14]*x[16]*x[19]*x[21]*x[24] - x[2]*x[3]*x[8]*x[9]*x[12]*x[17]*x[19]*x[25]*x[26] + x[2]*x[3]*x[8]*x[9]*x[12]*x[17]*x[20]*std::pow(x[25], 2) + x[2]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[13]*x[17]*x[20]*x[24]*x[25] + x[2]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[24]*x[26] - x[2]*x[3]*x[8]*x[10]*x[12]*x[17]*x[20]*x[24]*x[25] - x[2]*x[3]*x[8]*x[10]*x[13]*x[17]*x[18]*x[24]*x[26] + x[2]*x[3]*x[8]*x[10]*x[13]*x[17]*x[20]*std::pow(x[24], 2) - x[2]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[25]*x[26] + x[2]*x[3]*x[8]*x[10]*x[14]*x[15]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[25]*x[26] - x[2]*x[3]*x[8]*x[11]*x[12]*x[15]*x[20]*std::pow(x[25], 2) - x[2]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[24]*x[26] + x[2]*x[3]*x[8]*x[11]*x[12]*x[16]*x[20]*x[24]*x[25] - x[2]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[25]*x[26] + x[2]*x[3]*x[8]*x[11]*x[13]*x[15]*x[20]*x[24]*x[25] + x[2]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[24]*x[26] - x[2]*x[3]*x[8]*x[11]*x[13]*x[16]*x[20]*std::pow(x[24], 2) + x[2]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*x[22]*x[25] - x[2]*x[4]*x[6]*x[9]*x[14]*x[17]*x[19]*x[21]*x[25] - x[2]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[22]*x[24] + x[2]*x[4]*x[6]*x[10]*x[14]*x[17]*x[19]*x[21]*x[24] - x[2]*x[4]*x[6]*x[11]*x[12]*x[17]*x[18]*x[22]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[17]*x[19]*x[22]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[17]*x[18]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[13]*x[17]*x[19]*x[21]*x[24] + x[2]*x[4]*x[6]*x[11]*x[14]*x[15]*x[19]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[14]*x[15]*x[19]*x[22]*x[24] - x[2]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[21]*x[25] + x[2]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[22]*x[24] - x[2]*x[4]*x[7]*x[11]*x[12]*x[17]*x[21]*x[22]*x[25] + x[2]*x[4]*x[7]*x[11]*x[12]*x[17]*std::pow(x[22], 2)*x[24] + x[2]*x[4]*x[7]*x[11]*x[13]*x[17]*std::pow(x[21], 2)*x[25] - x[2]*x[4]*x[7]*x[11]*x[13]*x[17]*x[21]*x[22]*x[24] + x[2]*x[4]*x[7]*x[11]*x[14]*x[15]*x[21]*x[22]*x[25] - x[2]*x[4]*x[7]*x[11]*x[14]*x[15]*std::pow(x[22], 2)*x[24] - x[2]*x[4]*x[7]*x[11]*x[14]*x[16]*std::pow(x[21], 2)*x[25] + x[2]*x[4]*x[7]*x[11]*x[14]*x[16]*x[21]*x[22]*x[24] - x[2]*x[4]*x[8]*x[9]*x[12]*x[17]*x[22]*x[25]*x[26] + x[2]*x[4]*x[8]*x[9]*x[12]*x[17]*x[23]*std::pow(x[25], 2) + x[2]*x[4]*x[8]*x[9]*x[13]*x[17]*x[21]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[13]*x[17]*x[23]*x[24]*x[25] + x[2]*x[4]*x[8]*x[9]*x[14]*x[16]*x[21]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[14]*x[16]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[10]*x[12]*x[17]*x[22]*x[24]*x[26] - x[2]*x[4]*x[8]*x[10]*x[12]*x[17]*x[23]*x[24]*x[25] - x[2]*x[4]*x[8]*x[10]*x[13]*x[17]*x[21]*x[24]*x[26] + x[2]*x[4]*x[8]*x[10]*x[13]*x[17]*x[23]*std::pow(x[24], 2) - x[2]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[25]*x[26] + x[2]*x[4]*x[8]*x[10]*x[14]*x[15]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[11]*x[12]*x[15]*x[22]*x[25]*x[26] - x[2]*x[4]*x[8]*x[11]*x[12]*x[15]*x[23]*std::pow(x[25], 2) - x[2]*x[4]*x[8]*x[11]*x[12]*x[16]*x[22]*x[24]*x[26] + x[2]*x[4]*x[8]*x[11]*x[12]*x[16]*x[23]*x[24]*x[25] - x[2]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[25]*x[26] + x[2]*x[4]*x[8]*x[11]*x[13]*x[15]*x[23]*x[24]*x[25] + x[2]*x[4]*x[8]*x[11]*x[13]*x[16]*x[21]*x[24]*x[26] - x[2]*x[4]*x[8]*x[11]*x[13]*x[16]*x[23]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[24]*x[26] + x[2]*x[5]*x[6]*x[9]*x[14]*x[15]*x[19]*x[25]*x[26] - x[2]*x[5]*x[6]*x[9]*x[14]*x[15]*x[20]*std::pow(x[25], 2) - x[2]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[14]*x[16]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[25]*x[26] - x[2]*x[5]*x[6]*x[10]*x[12]*x[17]*x[19]*x[24]*x[26] - x[2]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[24]*x[26] + x[2]*x[5]*x[6]*x[10]*x[14]*x[15]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[10]*x[14]*x[16]*x[18]*x[24]*x[26] - x[2]*x[5]*x[6]*x[10]*x[14]*x[16]*x[20]*std::pow(x[24], 2) - x[2]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[25]*x[26] + x[2]*x[5]*x[6]*x[11]*x[12]*x[15]*x[20]*std::pow(x[25], 2) + x[2]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[25]*x[26] - x[2]*x[5]*x[6]*x[11]*x[12]*x[16]*x[20]*x[24]*x[25] + x[2]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[24]*x[26] - x[2]*x[5]*x[6]*x[11]*x[13]*x[15]*x[20]*x[24]*x[25] - x[2]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[24]*x[26] + x[2]*x[5]*x[6]*x[11]*x[13]*x[16]*x[20]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[9]*x[13]*x[17]*x[21]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[13]*x[17]*x[22]*x[24]*x[26] + x[2]*x[5]*x[7]*x[9]*x[14]*x[15]*x[22]*x[25]*x[26] - x[2]*x[5]*x[7]*x[9]*x[14]*x[15]*x[23]*std::pow(x[25], 2) - x[2]*x[5]*x[7]*x[9]*x[14]*x[16]*x[21]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[14]*x[16]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[25]*x[26] - x[2]*x[5]*x[7]*x[10]*x[12]*x[17]*x[22]*x[24]*x[26] - x[2]*x[5]*x[7]*x[10]*x[14]*x[15]*x[22]*x[24]*x[26] + x[2]*x[5]*x[7]*x[10]*x[14]*x[15]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[10]*x[14]*x[16]*x[21]*x[24]*x[26] - x[2]*x[5]*x[7]*x[10]*x[14]*x[16]*x[23]*std::pow(x[24], 2) - x[2]*x[5]*x[7]*x[11]*x[12]*x[15]*x[22]*x[25]*x[26] + x[2]*x[5]*x[7]*x[11]*x[12]*x[15]*x[23]*std::pow(x[25], 2) + x[2]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[25]*x[26] - x[2]*x[5]*x[7]*x[11]*x[12]*x[16]*x[23]*x[24]*x[25] + x[2]*x[5]*x[7]*x[11]*x[13]*x[15]*x[22]*x[24]*x[26] - x[2]*x[5]*x[7]*x[11]*x[13]*x[15]*x[23]*x[24]*x[25] - x[2]*x[5]*x[7]*x[11]*x[13]*x[16]*x[21]*x[24]*x[26] + x[2]*x[5]*x[7]*x[11]*x[13]*x[16]*x[23]*std::pow(x[24], 2),  // NOLINT [whitespace/line_length]
     -x[0]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*x[19]*x[22] + x[0]*x[3]*x[7]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[21] + x[0]*x[3]*x[7]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[22] - x[0]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[19]*x[21] + x[0]*x[3]*x[7]*x[11]*x[12]*x[17]*x[18]*x[19]*x[22] - x[0]*x[3]*x[7]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[21] - x[0]*x[3]*x[7]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[22] + x[0]*x[3]*x[7]*x[11]*x[13]*x[17]*x[18]*x[19]*x[21] + x[0]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[20]*x[25] - x[0]*x[3]*x[8]*x[9]*x[13]*x[17]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[26] + x[0]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[20]*x[25] + x[0]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[19]*x[26] - x[0]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[10]*x[12]*x[17]*x[18]*x[20]*x[25] + x[0]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[20]*x[24] + x[0]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[19]*x[26] - x[0]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[20]*x[25] - x[0]*x[3]*x[8]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[26] + x[0]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[20]*x[24] + x[0]*x[3]*x[8]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[26] - x[0]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[20]*x[25] - x[0]*x[3]*x[8]*x[11]*x[12]*x[16]*x[18]*x[19]*x[26] + x[0]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[20]*x[24] - x[0]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[19]*x[26] + x[0]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[20]*x[25] + x[0]*x[3]*x[8]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[26] - x[0]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[20]*x[24] + x[0]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*x[19]*x[22] - x[0]*x[4]*x[6]*x[9]*x[14]*x[17]*std::pow(x[19], 2)*x[21] - x[0]*x[4]*x[6]*x[10]*x[14]*x[17]*std::pow(x[18], 2)*x[22] + x[0]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[19]*x[21] - x[0]*x[4]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[22] + x[0]*x[4]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[21] + x[0]*x[4]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[22] - x[0]*x[4]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[21] + x[0]*x[4]*x[7]*x[11]*x[12]*x[17]*x[18]*std::pow(x[22], 2) - x[0]*x[4]*x[7]*x[11]*x[12]*x[17]*x[19]*x[21]*x[22] - x[0]*x[4]*x[7]*x[11]*x[13]*x[17]*x[18]*x[21]*x[22] + x[0]*x[4]*x[7]*x[11]*x[13]*x[17]*x[19]*std::pow(x[21], 2) - x[0]*x[4]*x[7]*x[11]*x[14]*x[15]*x[18]*std::pow(x[22], 2) + x[0]*x[4]*x[7]*x[11]*x[14]*x[15]*x[19]*x[21]*x[22] + x[0]*x[4]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[22] - x[0]*x[4]*x[7]*x[11]*x[14]*x[16]*x[19]*std::pow(x[21], 2) + x[0]*x[4]*x[8]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[0]*x[4]*x[8]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] - x[0]*x[4]*x[8]*x[9]*x[13]*x[17]*x[19]*x[23]*x[24] + x[0]*x[4]*x[8]*x[9]*x[13]*x[17]*x[20]*x[21]*x[25] - x[0]*x[4]*x[8]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] + x[0]*x[4]*x[8]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] + x[0]*x[4]*x[8]*x[9]*x[14]*x[16]*x[19]*x[21]*x[26] - x[0]*x[4]*x[8]*x[9]*x[14]*x[16]*x[20]*x[22]*x[24] - x[0]*x[4]*x[8]*x[10]*x[12]*x[17]*x[18]*x[23]*x[25] + x[0]*x[4]*x[8]*x[10]*x[12]*x[17]*x[20]*x[22]*x[24] + x[0]*x[4]*x[8]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] + x[0]*x[4]*x[8]*x[10]*x[14]*x[15]*x[18]*x[22]*x[26] - x[0]*x[4]*x[8]*x[10]*x[14]*x[15]*x[20]*x[21]*x[25] - x[0]*x[4]*x[8]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] + x[0]*x[4]*x[8]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] + x[0]*x[4]*x[8]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] - x[0]*x[4]*x[8]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[0]*x[4]*x[8]*x[11]*x[12]*x[16]*x[18]*x[22]*x[26] + x[0]*x[4]*x[8]*x[11]*x[12]*x[16]*x[19]*x[23]*x[24] + x[0]*x[4]*x[8]*x[11]*x[13]*x[15]*x[18]*x[23]*x[25] - x[0]*x[4]*x[8]*x[11]*x[13]*x[15]*x[19]*x[21]*x[26] + x[0]*x[4]*x[8]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] - x[0]*x[4]*x[8]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] + x[0]*x[5]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[26] - x[0]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[25] - x[0]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[26] + x[0]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[9]*x[14]*x[16]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[26] + x[0]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[26] - x[0]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[24] + x[0]*x[5]*x[6]*x[10]*x[14]*x[15]*x[18]*x[20]*x[25] - x[0]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[26] + x[0]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[20]*x[25] + x[0]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[19]*x[26] - x[0]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[25] + x[0]*x[5]*x[6]*x[11]*x[13]*x[15]*x[18]*x[19]*x[26] - x[0]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[24] - x[0]*x[5]*x[6]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[26] + x[0]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[20]*x[24] + x[0]*x[5]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] - x[0]*x[5]*x[7]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] - x[0]*x[5]*x[7]*x[9]*x[13]*x[17]*x[19]*x[21]*x[26] + x[0]*x[5]*x[7]*x[9]*x[13]*x[17]*x[20]*x[22]*x[24] - x[0]*x[5]*x[7]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[0]*x[5]*x[7]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] + x[0]*x[5]*x[7]*x[9]*x[14]*x[16]*x[19]*x[23]*x[24] - x[0]*x[5]*x[7]*x[9]*x[14]*x[16]*x[20]*x[21]*x[25] - x[0]*x[5]*x[7]*x[10]*x[12]*x[17]*x[18]*x[22]*x[26] + x[0]*x[5]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[25] + x[0]*x[5]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] - x[0]*x[5]*x[7]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] + x[0]*x[5]*x[7]*x[10]*x[14]*x[15]*x[18]*x[23]*x[25] - x[0]*x[5]*x[7]*x[10]*x[14]*x[15]*x[20]*x[22]*x[24] - x[0]*x[5]*x[7]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[0]*x[5]*x[7]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[0]*x[5]*x[7]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] + x[0]*x[5]*x[7]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[0]*x[5]*x[7]*x[11]*x[12]*x[16]*x[18]*x[23]*x[25] + x[0]*x[5]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[26] + x[0]*x[5]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[26] - x[0]*x[5]*x[7]*x[11]*x[13]*x[15]*x[19]*x[23]*x[24] - x[0]*x[5]*x[7]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] + x[0]*x[5]*x[7]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] - x[0]*x[5]*x[8]*x[9]*x[12]*x[16]*x[19]*std::pow(x[26], 2) + x[0]*x[5]*x[8]*x[9]*x[12]*x[16]*x[20]*x[25]*x[26] + x[0]*x[5]*x[8]*x[9]*x[13]*x[15]*x[19]*std::pow(x[26], 2) - x[0]*x[5]*x[8]*x[9]*x[13]*x[15]*x[20]*x[25]*x[26] + x[0]*x[5]*x[8]*x[10]*x[12]*x[16]*x[18]*std::pow(x[26], 2) - x[0]*x[5]*x[8]*x[10]*x[12]*x[16]*x[20]*x[24]*x[26] - x[0]*x[5]*x[8]*x[10]*x[13]*x[15]*x[18]*std::pow(x[26], 2) + x[0]*x[5]*x[8]*x[10]*x[13]*x[15]*x[20]*x[24]*x[26] - x[1]*x[3]*x[6]*x[11]*x[12]*x[17]*x[18]*x[19]*x[22] + x[1]*x[3]*x[6]*x[11]*x[12]*x[17]*std::pow(x[19], 2)*x[21] + x[1]*x[3]*x[6]*x[11]*x[13]*x[17]*std::pow(x[18], 2)*x[22] - x[1]*x[3]*x[6]*x[11]*x[13]*x[17]*x[18]*x[19]*x[21] + x[1]*x[3]*x[6]*x[11]*x[14]*x[15]*x[18]*x[19]*x[22] - x[1]*x[3]*x[6]*x[11]*x[14]*x[15]*std::pow(x[19], 2)*x[21] - x[1]*x[3]*x[6]*x[11]*x[14]*x[16]*std::pow(x[18], 2)*x[22] + x[1]*x[3]*x[6]*x[11]*x[14]*x[16]*x[18]*x[19]*x[21] - x[1]*x[3]*x[7]*x[9]*x[14]*x[17]*x[18]*std::pow(x[22], 2) + x[1]*x[3]*x[7]*x[9]*x[14]*x[17]*x[19]*x[21]*x[22] + x[1]*x[3]*x[7]*x[10]*x[14]*x[17]*x[18]*x[21]*x[22] - x[1]*x[3]*x[7]*x[10]*x[14]*x[17]*x[19]*std::pow(x[21], 2) + x[1]*x[3]*x[7]*x[11]*x[14]*x[15]*x[18]*std::pow(x[22], 2) - x[1]*x[3]*x[7]*x[11]*x[14]*x[15]*x[19]*x[21]*x[22] - x[1]*x[3]*x[7]*x[11]*x[14]*x[16]*x[18]*x[21]*x[22] + x[1]*x[3]*x[7]*x[11]*x[14]*x[16]*x[19]*std::pow(x[21], 2) - x[1]*x[3]*x[8]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] + x[1]*x[3]*x[8]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] + x[1]*x[3]*x[8]*x[9]*x[13]*x[17]*x[18]*x[23]*x[25] - x[1]*x[3]*x[8]*x[9]*x[13]*x[17]*x[20]*x[22]*x[24] - x[1]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] + x[1]*x[3]*x[8]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[1]*x[3]*x[8]*x[9]*x[14]*x[16]*x[18]*x[22]*x[26] - x[1]*x[3]*x[8]*x[9]*x[14]*x[16]*x[19]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[12]*x[17]*x[19]*x[23]*x[24] - x[1]*x[3]*x[8]*x[10]*x[12]*x[17]*x[20]*x[21]*x[25] - x[1]*x[3]*x[8]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] - x[1]*x[3]*x[8]*x[10]*x[14]*x[15]*x[18]*x[23]*x[25] + x[1]*x[3]*x[8]*x[10]*x[14]*x[15]*x[19]*x[21]*x[26] - x[1]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] + x[1]*x[3]*x[8]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[1]*x[3]*x[8]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] - x[1]*x[3]*x[8]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] - x[1]*x[3]*x[8]*x[11]*x[12]*x[16]*x[19]*x[21]*x[26] + x[1]*x[3]*x[8]*x[11]*x[12]*x[16]*x[20]*x[22]*x[24] - x[1]*x[3]*x[8]*x[11]*x[13]*x[15]*x[18]*x[22]*x[26] + x[1]*x[3]*x[8]*x[11]*x[13]*x[15]*x[20]*x[21]*x[25] + x[1]*x[3]*x[8]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] - x[1]*x[3]*x[8]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[1]*x[4]*x[6]*x[9]*x[14]*x[17]*x[18]*std::pow(x[22], 2) - x[1]*x[4]*x[6]*x[9]*x[14]*x[17]*x[19]*x[21]*x[22] - x[1]*x[4]*x[6]*x[10]*x[14]*x[17]*x[18]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[14]*x[17]*x[19]*std::pow(x[21], 2) - x[1]*x[4]*x[6]*x[11]*x[12]*x[17]*x[18]*std::pow(x[22], 2) + x[1]*x[4]*x[6]*x[11]*x[12]*x[17]*x[19]*x[21]*x[22] + x[1]*x[4]*x[6]*x[11]*x[13]*x[17]*x[18]*x[21]*x[22] - x[1]*x[4]*x[6]*x[11]*x[13]*x[17]*x[19]*std::pow(x[21], 2) + x[1]*x[4]*x[8]*x[9]*x[13]*x[17]*x[21]*x[23]*x[25] - x[1]*x[4]*x[8]*x[9]*x[13]*x[17]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[9]*x[14]*x[15]*std::pow(x[22], 2)*x[26] + x[1]*x[4]*x[8]*x[9]*x[14]*x[15]*x[22]*x[23]*x[25] + x[1]*x[4]*x[8]*x[9]*x[14]*x[16]*x[21]*x[22]*x[26] - x[1]*x[4]*x[8]*x[9]*x[14]*x[16]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[10]*x[12]*x[17]*x[21]*x[23]*x[25] + x[1]*x[4]*x[8]*x[10]*x[12]*x[17]*x[22]*x[23]*x[24] + x[1]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[22]*x[26] - x[1]*x[4]*x[8]*x[10]*x[14]*x[15]*x[21]*x[23]*x[25] - x[1]*x[4]*x[8]*x[10]*x[14]*x[16]*std::pow(x[21], 2)*x[26] + x[1]*x[4]*x[8]*x[10]*x[14]*x[16]*x[21]*x[23]*x[24] + x[1]*x[4]*x[8]*x[11]*x[12]*x[15]*std::pow(x[22], 2)*x[26] - x[1]*x[4]*x[8]*x[11]*x[12]*x[15]*x[22]*x[23]*x[25] - x[1]*x[4]*x[8]*x[11]*x[12]*x[16]*x[21]*x[22]*x[26] + x[1]*x[4]*x[8]*x[11]*x[12]*x[16]*x[22]*x[23]*x[24] - x[1]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[22]*x[26] + x[1]*x[4]*x[8]*x[11]*x[13]*x[15]*x[21]*x[23]*x[25] + x[1]*x[4]*x[8]*x[11]*x[13]*x[16]*std::pow(x[21], 2)*x[26] - x[1]*x[4]*x[8]*x[11]*x[13]*x[16]*x[21]*x[23]*x[24] + x[1]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] - x[1]*x[5]*x[6]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[13]*x[17]*x[18]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[17]*x[19]*x[23]*x[24] + x[1]*x[5]*x[6]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] - x[1]*x[5]*x[6]*x[9]*x[14]*x[16]*x[18]*x[23]*x[25] + x[1]*x[5]*x[6]*x[9]*x[14]*x[16]*x[20]*x[22]*x[24] + x[1]*x[5]*x[6]*x[10]*x[12]*x[17]*x[18]*x[23]*x[25] - x[1]*x[5]*x[6]*x[10]*x[12]*x[17]*x[19]*x[21]*x[26] + x[1]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] - x[1]*x[5]*x[6]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[15]*x[19]*x[23]*x[24] + x[1]*x[5]*x[6]*x[10]*x[14]*x[15]*x[20]*x[21]*x[25] + x[1]*x[5]*x[6]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] - x[1]*x[5]*x[6]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[1]*x[5]*x[6]*x[11]*x[12]*x[15]*x[19]*x[22]*x[26] + x[1]*x[5]*x[6]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] + x[1]*x[5]*x[6]*x[11]*x[12]*x[16]*x[18]*x[22]*x[26] - x[1]*x[5]*x[6]*x[11]*x[12]*x[16]*x[20]*x[21]*x[25] + x[1]*x[5]*x[6]*x[11]*x[13]*x[15]*x[19]*x[21]*x[26] - x[1]*x[5]*x[6]*x[11]*x[13]*x[15]*x[20]*x[22]*x[24] - x[1]*x[5]*x[6]*x[11]*x[13]*x[16]*x[18]*x[21]*x[26] + x[1]*x[5]*x[6]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[1]*x[5]*x[7]*x[9]*x[12]*x[17]*std::pow(x[22], 2)*x[26] - x[1]*x[5]*x[7]*x[9]*x[12]*x[17]*x[22]*x[23]*x[25] - x[1]*x[5]*x[7]*x[9]*x[13]*x[17]*x[21]*x[22]*x[26] + x[1]*x[5]*x[7]*x[9]*x[13]*x[17]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[9]*x[14]*x[16]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[9]*x[14]*x[16]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[22]*x[26] + x[1]*x[5]*x[7]*x[10]*x[12]*x[17]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[10]*x[13]*x[17]*std::pow(x[21], 2)*x[26] - x[1]*x[5]*x[7]*x[10]*x[13]*x[17]*x[21]*x[23]*x[24] + x[1]*x[5]*x[7]*x[10]*x[14]*x[15]*x[21]*x[23]*x[25] - x[1]*x[5]*x[7]*x[10]*x[14]*x[15]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[11]*x[12]*x[15]*std::pow(x[22], 2)*x[26] + x[1]*x[5]*x[7]*x[11]*x[12]*x[15]*x[22]*x[23]*x[25] + x[1]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[22]*x[26] - x[1]*x[5]*x[7]*x[11]*x[12]*x[16]*x[21]*x[23]*x[25] + x[1]*x[5]*x[7]*x[11]*x[13]*x[15]*x[21]*x[22]*x[26] - x[1]*x[5]*x[7]*x[11]*x[13]*x[15]*x[22]*x[23]*x[24] - x[1]*x[5]*x[7]*x[11]*x[13]*x[16]*std::pow(x[21], 2)*x[26] + x[1]*x[5]*x[7]*x[11]*x[13]*x[16]*x[21]*x[23]*x[24] - x[1]*x[5]*x[8]*x[9]*x[12]*x[16]*x[22]*std::pow(x[26], 2) + x[1]*x[5]*x[8]*x[9]*x[12]*x[16]*x[23]*x[25]*x[26] + x[1]*x[5]*x[8]*x[9]*x[13]*x[15]*x[22]*std::pow(x[26], 2) - x[1]*x[5]*x[8]*x[9]*x[13]*x[15]*x[23]*x[25]*x[26] + x[1]*x[5]*x[8]*x[10]*x[12]*x[16]*x[21]*std::pow(x[26], 2) - x[1]*x[5]*x[8]*x[10]*x[12]*x[16]*x[23]*x[24]*x[26] - x[1]*x[5]*x[8]*x[10]*x[13]*x[15]*x[21]*std::pow(x[26], 2) + x[1]*x[5]*x[8]*x[10]*x[13]*x[15]*x[23]*x[24]*x[26] - x[2]*x[3]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[26] + x[2]*x[3]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[25] + x[2]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[26] - x[2]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[26] - x[2]*x[3]*x[6]*x[9]*x[14]*x[15]*x[19]*x[20]*x[25] - x[2]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[19]*x[26] + x[2]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[26] - x[2]*x[3]*x[6]*x[10]*x[12]*x[17]*x[19]*x[20]*x[24] - x[2]*x[3]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[26] + x[2]*x[3]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[24] - x[2]*x[3]*x[6]*x[10]*x[14]*x[15]*x[18]*x[19]*x[26] + x[2]*x[3]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[24] + x[2]*x[3]*x[6]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[26] - x[2]*x[3]*x[6]*x[10]*x[14]*x[16]*x[18]*x[20]*x[24] + x[2]*x[3]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[25] - x[2]*x[3]*x[6]*x[11]*x[12]*x[16]*x[19]*x[20]*x[24] - x[2]*x[3]*x[6]*x[11]*x[13]*x[15]*x[18]*x[20]*x[25] + x[2]*x[3]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[24] - x[2]*x[3]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] + x[2]*x[3]*x[7]*x[9]*x[12]*x[17]*x[20]*x[22]*x[25] + x[2]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[22]*x[26] - x[2]*x[3]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] - x[2]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[23]*x[25] + x[2]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[17]*x[20]*x[22]*x[24] - x[2]*x[3]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[13]*x[17]*x[20]*x[21]*x[24] - x[2]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[26] + x[2]*x[3]*x[7]*x[10]*x[14]*x[15]*x[19]*x[23]*x[24] + x[2]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[23]*x[24] + x[2]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] - x[2]*x[3]*x[7]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] - x[2]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[23]*x[24] + x[2]*x[3]*x[7]*x[11]*x[12]*x[16]*x[20]*x[21]*x[25] - x[2]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[23]*x[25] + x[2]*x[3]*x[7]*x[11]*x[13]*x[15]*x[20]*x[22]*x[24] + x[2]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] - x[2]*x[3]*x[7]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] + x[2]*x[3]*x[8]*x[9]*x[12]*x[16]*x[19]*std::pow(x[26], 2) - x[2]*x[3]*x[8]*x[9]*x[12]*x[16]*x[20]*x[25]*x[26] - x[2]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*std::pow(x[26], 2) + x[2]*x[3]*x[8]*x[9]*x[13]*x[16]*x[20]*x[24]*x[26] - x[2]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*std::pow(x[26], 2) + x[2]*x[3]*x[8]*x[10]*x[12]*x[15]*x[20]*x[25]*x[26] + x[2]*x[3]*x[8]*x[10]*x[13]*x[15]*x[18]*std::pow(x[26], 2) - x[2]*x[3]*x[8]*x[10]*x[13]*x[15]*x[20]*x[24]*x[26] - x[2]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[22]*x[26] + x[2]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[23]*x[25] - x[2]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[23]*x[25] + x[2]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[21]*x[26] + x[2]*x[4]*x[6]*x[9]*x[14]*x[15]*x[19]*x[22]*x[26] - x[2]*x[4]*x[6]*x[9]*x[14]*x[15]*x[20]*x[22]*x[25] - x[2]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[22]*x[26] + x[2]*x[4]*x[6]*x[9]*x[14]*x[16]*x[20]*x[21]*x[25] + x[2]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[22]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[17]*x[19]*x[23]*x[24] - x[2]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[23]*x[24] - x[2]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[14]*x[15]*x[20]*x[22]*x[24] + x[2]*x[4]*x[6]*x[10]*x[14]*x[16]*x[18]*x[21]*x[26] - x[2]*x[4]*x[6]*x[10]*x[14]*x[16]*x[20]*x[21]*x[24] - x[2]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[23]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[15]*x[20]*x[22]*x[25] + x[2]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[23]*x[25] - x[2]*x[4]*x[6]*x[11]*x[12]*x[16]*x[20]*x[22]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[23]*x[24] - x[2]*x[4]*x[6]*x[11]*x[13]*x[15]*x[20]*x[21]*x[25] - x[2]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[23]*x[24] + x[2]*x[4]*x[6]*x[11]*x[13]*x[16]*x[20]*x[21]*x[24] - x[2]*x[4]*x[7]*x[9]*x[12]*x[17]*std::pow(x[22], 2)*x[26] + x[2]*x[4]*x[7]*x[9]*x[12]*x[17]*x[22]*x[23]*x[25] + x[2]*x[4]*x[7]*x[9]*x[13]*x[17]*x[21]*x[22]*x[26] - x[2]*x[4]*x[7]*x[9]*x[13]*x[17]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[9]*x[14]*x[15]*std::pow(x[22], 2)*x[26] - x[2]*x[4]*x[7]*x[9]*x[14]*x[15]*x[22]*x[23]*x[25] - x[2]*x[4]*x[7]*x[9]*x[14]*x[16]*x[21]*x[22]*x[26] + x[2]*x[4]*x[7]*x[9]*x[14]*x[16]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[10]*x[12]*x[17]*x[21]*x[22]*x[26] - x[2]*x[4]*x[7]*x[10]*x[12]*x[17]*x[22]*x[23]*x[24] - x[2]*x[4]*x[7]*x[10]*x[13]*x[17]*std::pow(x[21], 2)*x[26] + x[2]*x[4]*x[7]*x[10]*x[13]*x[17]*x[21]*x[23]*x[24] - x[2]*x[4]*x[7]*x[10]*x[14]*x[15]*x[21]*x[22]*x[26] + x[2]*x[4]*x[7]*x[10]*x[14]*x[15]*x[22]*x[23]*x[24] + x[2]*x[4]*x[7]*x[10]*x[14]*x[16]*std::pow(x[21], 2)*x[26] - x[2]*x[4]*x[7]*x[10]*x[14]*x[16]*x[21]*x[23]*x[24] + x[2]*x[4]*x[7]*x[11]*x[12]*x[16]*x[21]*x[23]*x[25] - x[2]*x[4]*x[7]*x[11]*x[12]*x[16]*x[22]*x[23]*x[24] - x[2]*x[4]*x[7]*x[11]*x[13]*x[15]*x[21]*x[23]*x[25] + x[2]*x[4]*x[7]*x[11]*x[13]*x[15]*x[22]*x[23]*x[24] + x[2]*x[4]*x[8]*x[9]*x[12]*x[16]*x[22]*std::pow(x[26], 2) - x[2]*x[4]*x[8]*x[9]*x[12]*x[16]*x[23]*x[25]*x[26] - x[2]*x[4]*x[8]*x[9]*x[13]*x[16]*x[21]*std::pow(x[26], 2) + x[2]*x[4]*x[8]*x[9]*x[13]*x[16]*x[23]*x[24]*x[26] - x[2]*x[4]*x[8]*x[10]*x[12]*x[15]*x[22]*std::pow(x[26], 2) + x[2]*x[4]*x[8]*x[10]*x[12]*x[15]*x[23]*x[25]*x[26] + x[2]*x[4]*x[8]*x[10]*x[13]*x[15]*x[21]*std::pow(x[26], 2) - x[2]*x[4]*x[8]*x[10]*x[13]*x[15]*x[23]*x[24]*x[26] - x[2]*x[5]*x[6]*x[9]*x[13]*x[15]*x[19]*std::pow(x[26], 2) + x[2]*x[5]*x[6]*x[9]*x[13]*x[15]*x[20]*x[25]*x[26] + x[2]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*std::pow(x[26], 2) - x[2]*x[5]*x[6]*x[9]*x[13]*x[16]*x[20]*x[24]*x[26] + x[2]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*std::pow(x[26], 2) - x[2]*x[5]*x[6]*x[10]*x[12]*x[15]*x[20]*x[25]*x[26] - x[2]*x[5]*x[6]*x[10]*x[12]*x[16]*x[18]*std::pow(x[26], 2) + x[2]*x[5]*x[6]*x[10]*x[12]*x[16]*x[20]*x[24]*x[26] - x[2]*x[5]*x[7]*x[9]*x[13]*x[15]*x[22]*std::pow(x[26], 2) + x[2]*x[5]*x[7]*x[9]*x[13]*x[15]*x[23]*x[25]*x[26] + x[2]*x[5]*x[7]*x[9]*x[13]*x[16]*x[21]*std::pow(x[26], 2) - x[2]*x[5]*x[7]*x[9]*x[13]*x[16]*x[23]*x[24]*x[26] + x[2]*x[5]*x[7]*x[10]*x[12]*x[15]*x[22]*std::pow(x[26], 2) - x[2]*x[5]*x[7]*x[10]*x[12]*x[15]*x[23]*x[25]*x[26] - x[2]*x[5]*x[7]*x[10]*x[12]*x[16]*x[21]*std::pow(x[26], 2) + x[2]*x[5]*x[7]*x[10]*x[12]*x[16]*x[23]*x[24]*x[26],  // NOLINT [whitespace/line_length]
     x[0]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[20]*x[22] - x[0]*x[3]*x[7]*x[9]*x[13]*x[17]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[23] + x[0]*x[3]*x[7]*x[9]*x[14]*x[15]*x[19]*x[20]*x[22] + x[0]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[19]*x[23] - x[0]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[10]*x[12]*x[17]*x[18]*x[20]*x[22] + x[0]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[20]*x[21] + x[0]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[19]*x[23] - x[0]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[20]*x[22] - x[0]*x[3]*x[7]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[23] + x[0]*x[3]*x[7]*x[10]*x[14]*x[16]*x[18]*x[20]*x[21] + x[0]*x[3]*x[7]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[23] - x[0]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[20]*x[22] - x[0]*x[3]*x[7]*x[11]*x[12]*x[16]*x[18]*x[19]*x[23] + x[0]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[20]*x[21] - x[0]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[19]*x[23] + x[0]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[20]*x[22] + x[0]*x[3]*x[7]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[23] - x[0]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[20]*x[21] + x[0]*x[3]*x[8]*x[9]*x[13]*x[15]*x[19]*x[20]*x[26] - x[0]*x[3]*x[8]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[25] - x[0]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*x[20]*x[26] + x[0]*x[3]*x[8]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[24] - x[0]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*x[20]*x[26] + x[0]*x[3]*x[8]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[25] + x[0]*x[3]*x[8]*x[10]*x[12]*x[16]*x[18]*x[20]*x[26] - x[0]*x[3]*x[8]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[24] + x[0]*x[4]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[23] - x[0]*x[4]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[22] - x[0]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[23] + x[0]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[9]*x[14]*x[16]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[23] + x[0]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[23] - x[0]*x[4]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[21] + x[0]*x[4]*x[6]*x[10]*x[14]*x[15]*x[18]*x[20]*x[22] - x[0]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[11]*x[12]*x[15]*std::pow(x[19], 2)*x[23] + x[0]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[20]*x[22] + x[0]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[19]*x[23] - x[0]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[22] + x[0]*x[4]*x[6]*x[11]*x[13]*x[15]*x[18]*x[19]*x[23] - x[0]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[21] - x[0]*x[4]*x[6]*x[11]*x[13]*x[16]*std::pow(x[18], 2)*x[23] + x[0]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[20]*x[21] + x[0]*x[4]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[23] - x[0]*x[4]*x[7]*x[9]*x[12]*x[17]*x[20]*std::pow(x[22], 2) - x[0]*x[4]*x[7]*x[9]*x[13]*x[17]*x[19]*x[21]*x[23] + x[0]*x[4]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[9]*x[14]*x[15]*x[19]*x[22]*x[23] + x[0]*x[4]*x[7]*x[9]*x[14]*x[15]*x[20]*std::pow(x[22], 2) + x[0]*x[4]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[23] - x[0]*x[4]*x[7]*x[9]*x[14]*x[16]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[10]*x[12]*x[17]*x[18]*x[22]*x[23] + x[0]*x[4]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[22] + x[0]*x[4]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[23] - x[0]*x[4]*x[7]*x[10]*x[13]*x[17]*x[20]*std::pow(x[21], 2) + x[0]*x[4]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[23] - x[0]*x[4]*x[7]*x[10]*x[14]*x[15]*x[20]*x[21]*x[22] - x[0]*x[4]*x[7]*x[10]*x[14]*x[16]*x[18]*x[21]*x[23] + x[0]*x[4]*x[7]*x[10]*x[14]*x[16]*x[20]*std::pow(x[21], 2) - x[0]*x[4]*x[7]*x[11]*x[12]*x[16]*x[18]*x[22]*x[23] + x[0]*x[4]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[23] + x[0]*x[4]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[23] - x[0]*x[4]*x[7]*x[11]*x[13]*x[15]*x[19]*x[21]*x[23] - x[0]*x[4]*x[8]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] + x[0]*x[4]*x[8]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[0]*x[4]*x[8]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] - x[0]*x[4]*x[8]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[0]*x[4]*x[8]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] + x[0]*x[4]*x[8]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] + x[0]*x[4]*x[8]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[0]*x[4]*x[8]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] - x[0]*x[4]*x[8]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] - x[0]*x[4]*x[8]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] + x[0]*x[4]*x[8]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[0]*x[5]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[26] + x[0]*x[5]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[25] + x[0]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*x[20]*x[26] - x[0]*x[5]*x[6]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[24] + x[0]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*x[20]*x[26] - x[0]*x[5]*x[6]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[25] - x[0]*x[5]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[26] + x[0]*x[5]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[24] - x[0]*x[5]*x[7]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] + x[0]*x[5]*x[7]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] + x[0]*x[5]*x[7]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] - x[0]*x[5]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[0]*x[5]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] - x[0]*x[5]*x[7]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] + x[0]*x[5]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[0]*x[5]*x[7]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[0]*x[5]*x[7]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] - x[0]*x[5]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[0]*x[5]*x[7]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] + x[0]*x[5]*x[7]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] - x[1]*x[3]*x[6]*x[9]*x[12]*x[17]*std::pow(x[19], 2)*x[23] + x[1]*x[3]*x[6]*x[9]*x[12]*x[17]*x[19]*x[20]*x[22] + x[1]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[19]*x[23] - x[1]*x[3]*x[6]*x[9]*x[13]*x[17]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[9]*x[14]*x[15]*std::pow(x[19], 2)*x[23] - x[1]*x[3]*x[6]*x[9]*x[14]*x[15]*x[19]*x[20]*x[22] - x[1]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[19]*x[23] + x[1]*x[3]*x[6]*x[9]*x[14]*x[16]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[10]*x[12]*x[17]*x[18]*x[19]*x[23] - x[1]*x[3]*x[6]*x[10]*x[12]*x[17]*x[19]*x[20]*x[21] - x[1]*x[3]*x[6]*x[10]*x[13]*x[17]*std::pow(x[18], 2)*x[23] + x[1]*x[3]*x[6]*x[10]*x[13]*x[17]*x[18]*x[20]*x[21] - x[1]*x[3]*x[6]*x[10]*x[14]*x[15]*x[18]*x[19]*x[23] + x[1]*x[3]*x[6]*x[10]*x[14]*x[15]*x[19]*x[20]*x[21] + x[1]*x[3]*x[6]*x[10]*x[14]*x[16]*std::pow(x[18], 2)*x[23] - x[1]*x[3]*x[6]*x[10]*x[14]*x[16]*x[18]*x[20]*x[21] + x[1]*x[3]*x[6]*x[11]*x[12]*x[16]*x[18]*x[20]*x[22] - x[1]*x[3]*x[6]*x[11]*x[12]*x[16]*x[19]*x[20]*x[21] - x[1]*x[3]*x[6]*x[11]*x[13]*x[15]*x[18]*x[20]*x[22] + x[1]*x[3]*x[6]*x[11]*x[13]*x[15]*x[19]*x[20]*x[21] - x[1]*x[3]*x[7]*x[9]*x[12]*x[17]*x[19]*x[22]*x[23] + x[1]*x[3]*x[7]*x[9]*x[12]*x[17]*x[20]*std::pow(x[22], 2) + x[1]*x[3]*x[7]*x[9]*x[13]*x[17]*x[18]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[13]*x[17]*x[20]*x[21]*x[22] + x[1]*x[3]*x[7]*x[9]*x[14]*x[16]*x[18]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[14]*x[16]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[10]*x[12]*x[17]*x[19]*x[21]*x[23] - x[1]*x[3]*x[7]*x[10]*x[12]*x[17]*x[20]*x[21]*x[22] - x[1]*x[3]*x[7]*x[10]*x[13]*x[17]*x[18]*x[21]*x[23] + x[1]*x[3]*x[7]*x[10]*x[13]*x[17]*x[20]*std::pow(x[21], 2) - x[1]*x[3]*x[7]*x[10]*x[14]*x[15]*x[18]*x[22]*x[23] + x[1]*x[3]*x[7]*x[10]*x[14]*x[15]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[11]*x[12]*x[15]*x[19]*x[22]*x[23] - x[1]*x[3]*x[7]*x[11]*x[12]*x[15]*x[20]*std::pow(x[22], 2) - x[1]*x[3]*x[7]*x[11]*x[12]*x[16]*x[19]*x[21]*x[23] + x[1]*x[3]*x[7]*x[11]*x[12]*x[16]*x[20]*x[21]*x[22] - x[1]*x[3]*x[7]*x[11]*x[13]*x[15]*x[18]*x[22]*x[23] + x[1]*x[3]*x[7]*x[11]*x[13]*x[15]*x[20]*x[21]*x[22] + x[1]*x[3]*x[7]*x[11]*x[13]*x[16]*x[18]*x[21]*x[23] - x[1]*x[3]*x[7]*x[11]*x[13]*x[16]*x[20]*std::pow(x[21], 2) + x[1]*x[3]*x[8]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] - x[1]*x[3]*x[8]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[1]*x[3]*x[8]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] - x[1]*x[3]*x[8]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[1]*x[3]*x[8]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] + x[1]*x[3]*x[8]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] - x[1]*x[3]*x[8]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] + x[1]*x[3]*x[8]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] + x[1]*x[3]*x[8]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[1]*x[3]*x[8]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[1]*x[3]*x[8]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] - x[1]*x[3]*x[8]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[1]*x[4]*x[6]*x[9]*x[13]*x[17]*x[18]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[13]*x[17]*x[19]*x[21]*x[23] + x[1]*x[4]*x[6]*x[9]*x[14]*x[15]*x[19]*x[22]*x[23] - x[1]*x[4]*x[6]*x[9]*x[14]*x[15]*x[20]*std::pow(x[22], 2) - x[1]*x[4]*x[6]*x[9]*x[14]*x[16]*x[18]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[14]*x[16]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[12]*x[17]*x[18]*x[22]*x[23] - x[1]*x[4]*x[6]*x[10]*x[12]*x[17]*x[19]*x[21]*x[23] - x[1]*x[4]*x[6]*x[10]*x[14]*x[15]*x[19]*x[21]*x[23] + x[1]*x[4]*x[6]*x[10]*x[14]*x[15]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[10]*x[14]*x[16]*x[18]*x[21]*x[23] - x[1]*x[4]*x[6]*x[10]*x[14]*x[16]*x[20]*std::pow(x[21], 2) - x[1]*x[4]*x[6]*x[11]*x[12]*x[15]*x[19]*x[22]*x[23] + x[1]*x[4]*x[6]*x[11]*x[12]*x[15]*x[20]*std::pow(x[22], 2) + x[1]*x[4]*x[6]*x[11]*x[12]*x[16]*x[18]*x[22]*x[23] - x[1]*x[4]*x[6]*x[11]*x[12]*x[16]*x[20]*x[21]*x[22] + x[1]*x[4]*x[6]*x[11]*x[13]*x[15]*x[19]*x[21]*x[23] - x[1]*x[4]*x[6]*x[11]*x[13]*x[15]*x[20]*x[21]*x[22] - x[1]*x[4]*x[6]*x[11]*x[13]*x[16]*x[18]*x[21]*x[23] + x[1]*x[4]*x[6]*x[11]*x[13]*x[16]*x[20]*std::pow(x[21], 2) + x[1]*x[4]*x[8]*x[9]*x[13]*x[15]*x[22]*x[23]*x[26] - x[1]*x[4]*x[8]*x[9]*x[13]*x[15]*std::pow(x[23], 2)*x[25] - x[1]*x[4]*x[8]*x[9]*x[13]*x[16]*x[21]*x[23]*x[26] + x[1]*x[4]*x[8]*x[9]*x[13]*x[16]*std::pow(x[23], 2)*x[24] - x[1]*x[4]*x[8]*x[10]*x[12]*x[15]*x[22]*x[23]*x[26] + x[1]*x[4]*x[8]*x[10]*x[12]*x[15]*std::pow(x[23], 2)*x[25] + x[1]*x[4]*x[8]*x[10]*x[12]*x[16]*x[21]*x[23]*x[26] - x[1]*x[4]*x[8]*x[10]*x[12]*x[16]*std::pow(x[23], 2)*x[24] - x[1]*x[5]*x[6]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[1]*x[5]*x[6]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[1]*x[5]*x[6]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] - x[1]*x[5]*x[6]*x[9]*x[13]*x[16]*x[20]*x[23]*x[24] + x[1]*x[5]*x[6]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] - x[1]*x[5]*x[6]*x[10]*x[12]*x[15]*x[20]*x[23]*x[25] - x[1]*x[5]*x[6]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] + x[1]*x[5]*x[6]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] - x[1]*x[5]*x[6]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] + x[1]*x[5]*x[6]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] - x[1]*x[5]*x[7]*x[9]*x[12]*x[16]*x[22]*x[23]*x[26] + x[1]*x[5]*x[7]*x[9]*x[12]*x[16]*std::pow(x[23], 2)*x[25] + x[1]*x[5]*x[7]*x[9]*x[13]*x[16]*x[21]*x[23]*x[26] - x[1]*x[5]*x[7]*x[9]*x[13]*x[16]*std::pow(x[23], 2)*x[24] + x[1]*x[5]*x[7]*x[10]*x[12]*x[15]*x[22]*x[23]*x[26] - x[1]*x[5]*x[7]*x[10]*x[12]*x[15]*std::pow(x[23], 2)*x[25] - x[1]*x[5]*x[7]*x[10]*x[13]*x[15]*x[21]*x[23]*x[26] + x[1]*x[5]*x[7]*x[10]*x[13]*x[15]*std::pow(x[23], 2)*x[24] + x[2]*x[3]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[26] - x[2]*x[3]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[25] - x[2]*x[3]*x[6]*x[9]*x[13]*x[15]*x[19]*x[20]*x[26] + x[2]*x[3]*x[6]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[25] - x[2]*x[3]*x[6]*x[10]*x[12]*x[16]*x[18]*x[20]*x[26] + x[2]*x[3]*x[6]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[24] + x[2]*x[3]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[26] - x[2]*x[3]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[24] + x[2]*x[3]*x[7]*x[9]*x[12]*x[16]*x[19]*x[23]*x[26] - x[2]*x[3]*x[7]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[26] + x[2]*x[3]*x[7]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] - x[2]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] + x[2]*x[3]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[2]*x[3]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[26] + x[2]*x[3]*x[7]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[2]*x[3]*x[7]*x[10]*x[13]*x[15]*x[18]*x[23]*x[26] - x[2]*x[3]*x[7]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] + x[2]*x[4]*x[6]*x[9]*x[12]*x[16]*x[20]*x[22]*x[26] - x[2]*x[4]*x[6]*x[9]*x[12]*x[16]*x[20]*x[23]*x[25] - x[2]*x[4]*x[6]*x[9]*x[13]*x[15]*x[19]*x[23]*x[26] + x[2]*x[4]*x[6]*x[9]*x[13]*x[15]*x[20]*x[23]*x[25] + x[2]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*x[23]*x[26] - x[2]*x[4]*x[6]*x[9]*x[13]*x[16]*x[20]*x[21]*x[26] + x[2]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*x[23]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[15]*x[20]*x[22]*x[26] - x[2]*x[4]*x[6]*x[10]*x[12]*x[16]*x[18]*x[23]*x[26] + x[2]*x[4]*x[6]*x[10]*x[12]*x[16]*x[20]*x[23]*x[24] + x[2]*x[4]*x[6]*x[10]*x[13]*x[15]*x[20]*x[21]*x[26] - x[2]*x[4]*x[6]*x[10]*x[13]*x[15]*x[20]*x[23]*x[24] + x[2]*x[4]*x[7]*x[9]*x[12]*x[16]*x[22]*x[23]*x[26] - x[2]*x[4]*x[7]*x[9]*x[12]*x[16]*std::pow(x[23], 2)*x[25] - x[2]*x[4]*x[7]*x[9]*x[13]*x[15]*x[22]*x[23]*x[26] + x[2]*x[4]*x[7]*x[9]*x[13]*x[15]*std::pow(x[23], 2)*x[25] - x[2]*x[4]*x[7]*x[10]*x[12]*x[16]*x[21]*x[23]*x[26] + x[2]*x[4]*x[7]*x[10]*x[12]*x[16]*std::pow(x[23], 2)*x[24] + x[2]*x[4]*x[7]*x[10]*x[13]*x[15]*x[21]*x[23]*x[26] - x[2]*x[4]*x[7]*x[10]*x[13]*x[15]*std::pow(x[23], 2)*x[24],  // NOLINT [whitespace/line_length]
     x[0]*x[3]*x[7]*x[9]*x[13]*x[15]*x[19]*x[20]*x[23] - x[0]*x[3]*x[7]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[22] - x[0]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*x[20]*x[23] + x[0]*x[3]*x[7]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[21] - x[0]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*x[20]*x[23] + x[0]*x[3]*x[7]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[22] + x[0]*x[3]*x[7]*x[10]*x[12]*x[16]*x[18]*x[20]*x[23] - x[0]*x[3]*x[7]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[21] - x[0]*x[4]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[23] + x[0]*x[4]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[22] + x[0]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*x[20]*x[23] - x[0]*x[4]*x[6]*x[9]*x[13]*x[16]*std::pow(x[20], 2)*x[21] + x[0]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*x[20]*x[23] - x[0]*x[4]*x[6]*x[10]*x[12]*x[15]*std::pow(x[20], 2)*x[22] - x[0]*x[4]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[23] + x[0]*x[4]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[21] - x[0]*x[4]*x[7]*x[9]*x[12]*x[16]*x[19]*std::pow(x[23], 2) + x[0]*x[4]*x[7]*x[9]*x[12]*x[16]*x[20]*x[22]*x[23] + x[0]*x[4]*x[7]*x[9]*x[13]*x[15]*x[19]*std::pow(x[23], 2) - x[0]*x[4]*x[7]*x[9]*x[13]*x[15]*x[20]*x[22]*x[23] + x[0]*x[4]*x[7]*x[10]*x[12]*x[16]*x[18]*std::pow(x[23], 2) - x[0]*x[4]*x[7]*x[10]*x[12]*x[16]*x[20]*x[21]*x[23] - x[0]*x[4]*x[7]*x[10]*x[13]*x[15]*x[18]*std::pow(x[23], 2) + x[0]*x[4]*x[7]*x[10]*x[13]*x[15]*x[20]*x[21]*x[23] + x[1]*x[3]*x[6]*x[9]*x[12]*x[16]*x[19]*x[20]*x[23] - x[1]*x[3]*x[6]*x[9]*x[12]*x[16]*std::pow(x[20], 2)*x[22] - x[1]*x[3]*x[6]*x[9]*x[13]*x[15]*x[19]*x[20]*x[23] + x[1]*x[3]*x[6]*x[9]*x[13]*x[15]*std::pow(x[20], 2)*x[22] - x[1]*x[3]*x[6]*x[10]*x[12]*x[16]*x[18]*x[20]*x[23] + x[1]*x[3]*x[6]*x[10]*x[12]*x[16]*std::pow(x[20], 2)*x[21] + x[1]*x[3]*x[6]*x[10]*x[13]*x[15]*x[18]*x[20]*x[23] - x[1]*x[3]*x[6]*x[10]*x[13]*x[15]*std::pow(x[20], 2)*x[21] + x[1]*x[3]*x[7]*x[9]*x[12]*x[16]*x[19]*std::pow(x[23], 2) - x[1]*x[3]*x[7]*x[9]*x[12]*x[16]*x[20]*x[22]*x[23] - x[1]*x[3]*x[7]*x[9]*x[13]*x[16]*x[18]*std::pow(x[23], 2) + x[1]*x[3]*x[7]*x[9]*x[13]*x[16]*x[20]*x[21]*x[23] - x[1]*x[3]*x[7]*x[10]*x[12]*x[15]*x[19]*std::pow(x[23], 2) + x[1]*x[3]*x[7]*x[10]*x[12]*x[15]*x[20]*x[22]*x[23] + x[1]*x[3]*x[7]*x[10]*x[13]*x[15]*x[18]*std::pow(x[23], 2) - x[1]*x[3]*x[7]*x[10]*x[13]*x[15]*x[20]*x[21]*x[23] - x[1]*x[4]*x[6]*x[9]*x[13]*x[15]*x[19]*std::pow(x[23], 2) + x[1]*x[4]*x[6]*x[9]*x[13]*x[15]*x[20]*x[22]*x[23] + x[1]*x[4]*x[6]*x[9]*x[13]*x[16]*x[18]*std::pow(x[23], 2) - x[1]*x[4]*x[6]*x[9]*x[13]*x[16]*x[20]*x[21]*x[23] + x[1]*x[4]*x[6]*x[10]*x[12]*x[15]*x[19]*std::pow(x[23], 2) - x[1]*x[4]*x[6]*x[10]*x[12]*x[15]*x[20]*x[22]*x[23] - x[1]*x[4]*x[6]*x[10]*x[12]*x[16]*x[18]*std::pow(x[23], 2) + x[1]*x[4]*x[6]*x[10]*x[12]*x[16]*x[20]*x[21]*x[23];  // NOLINT [whitespace/line_length]

        return coeffs;
    }